

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  int iVar9;
  undefined4 uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  code *pcVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  undefined8 uVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  long lVar75;
  int iVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  byte bVar86;
  byte bVar87;
  ulong uVar88;
  uint uVar89;
  uint uVar90;
  ulong uVar91;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar98;
  undefined1 auVar106 [16];
  long lVar92;
  uint uVar93;
  ulong uVar94;
  byte bVar95;
  ulong uVar96;
  float fVar97;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar151;
  float fVar152;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar105 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar154;
  float fVar157;
  float fVar158;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar159;
  undefined4 uVar160;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined8 uVar161;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar178;
  float fVar179;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar185;
  undefined1 auVar184 [64];
  float fVar186;
  float fVar200;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar199;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [64];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  uint uVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  undefined8 local_670;
  undefined8 uStack_668;
  Precalculations *local_660;
  RTCFilterFunctionNArguments local_658;
  long local_628;
  undefined1 local_620 [32];
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined4 local_510;
  undefined4 uStack_50c;
  undefined8 uStack_508;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_410 [16];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  byte local_350;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  int local_2d0;
  int iStack_2cc;
  int iStack_2c8;
  int iStack_2c4;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined1 local_270 [16];
  uint local_260;
  uint uStack_25c;
  uint uStack_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  uint uStack_248;
  uint uStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar8 = prim[1];
  uVar96 = (ulong)(byte)PVar8;
  lVar75 = uVar96 * 0x19;
  fVar186 = *(float *)(prim + lVar75 + 0x12);
  auVar21 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar103 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar104 = vsubps_avx(auVar21,*(undefined1 (*) [16])(prim + lVar75 + 6));
  fVar178 = fVar186 * auVar104._0_4_;
  fVar159 = fVar186 * auVar103._0_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar96 * 4 + 6);
  auVar114 = vpmovsxbd_avx2(auVar21);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar96 * 5 + 6);
  auVar112 = vpmovsxbd_avx2(auVar102);
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar96 * 6 + 6);
  auVar124 = vpmovsxbd_avx2(auVar101);
  auVar124 = vcvtdq2ps_avx(auVar124);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = *(ulong *)(prim + uVar96 * 0xb + 6);
  auVar125 = vpmovsxbd_avx2(auVar99);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6);
  auVar121 = vpmovsxbd_avx2(auVar106);
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar123 = vcvtdq2ps_avx(auVar121);
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + (uint)(byte)PVar8 * 0xc + uVar96 + 6);
  auVar113 = vpmovsxbd_avx2(auVar223);
  auVar113 = vcvtdq2ps_avx(auVar113);
  uVar94 = (ulong)(uint)((int)(uVar96 * 9) * 2);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar94 + 6);
  auVar115 = vpmovsxbd_avx2(auVar6);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar94 + uVar96 + 6);
  auVar116 = vpmovsxbd_avx2(auVar7);
  auVar116 = vcvtdq2ps_avx(auVar116);
  uVar88 = (ulong)(uint)((int)(uVar96 * 5) << 2);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar88 + 6);
  auVar111 = vpmovsxbd_avx2(auVar100);
  auVar122 = vcvtdq2ps_avx(auVar111);
  auVar214._4_4_ = fVar159;
  auVar214._0_4_ = fVar159;
  auVar214._8_4_ = fVar159;
  auVar214._12_4_ = fVar159;
  auVar214._16_4_ = fVar159;
  auVar214._20_4_ = fVar159;
  auVar214._24_4_ = fVar159;
  auVar214._28_4_ = fVar159;
  auVar216._8_4_ = 1;
  auVar216._0_8_ = 0x100000001;
  auVar216._12_4_ = 1;
  auVar216._16_4_ = 1;
  auVar216._20_4_ = 1;
  auVar216._24_4_ = 1;
  auVar216._28_4_ = 1;
  auVar109 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar118 = ZEXT1632(CONCAT412(fVar186 * auVar103._12_4_,
                                CONCAT48(fVar186 * auVar103._8_4_,
                                         CONCAT44(fVar186 * auVar103._4_4_,fVar159))));
  auVar117 = vpermps_avx2(auVar216,auVar118);
  auVar110 = vpermps_avx512vl(auVar109,auVar118);
  fVar159 = auVar110._0_4_;
  fVar199 = auVar110._4_4_;
  auVar118._4_4_ = fVar199 * auVar124._4_4_;
  auVar118._0_4_ = fVar159 * auVar124._0_4_;
  fVar200 = auVar110._8_4_;
  auVar118._8_4_ = fVar200 * auVar124._8_4_;
  fVar179 = auVar110._12_4_;
  auVar118._12_4_ = fVar179 * auVar124._12_4_;
  fVar185 = auVar110._16_4_;
  auVar118._16_4_ = fVar185 * auVar124._16_4_;
  fVar97 = auVar110._20_4_;
  auVar118._20_4_ = fVar97 * auVar124._20_4_;
  fVar98 = auVar110._24_4_;
  auVar118._24_4_ = fVar98 * auVar124._24_4_;
  auVar118._28_4_ = auVar121._28_4_;
  auVar121._4_4_ = auVar113._4_4_ * fVar199;
  auVar121._0_4_ = auVar113._0_4_ * fVar159;
  auVar121._8_4_ = auVar113._8_4_ * fVar200;
  auVar121._12_4_ = auVar113._12_4_ * fVar179;
  auVar121._16_4_ = auVar113._16_4_ * fVar185;
  auVar121._20_4_ = auVar113._20_4_ * fVar97;
  auVar121._24_4_ = auVar113._24_4_ * fVar98;
  auVar121._28_4_ = auVar111._28_4_;
  auVar111._4_4_ = auVar122._4_4_ * fVar199;
  auVar111._0_4_ = auVar122._0_4_ * fVar159;
  auVar111._8_4_ = auVar122._8_4_ * fVar200;
  auVar111._12_4_ = auVar122._12_4_ * fVar179;
  auVar111._16_4_ = auVar122._16_4_ * fVar185;
  auVar111._20_4_ = auVar122._20_4_ * fVar97;
  auVar111._24_4_ = auVar122._24_4_ * fVar98;
  auVar111._28_4_ = auVar110._28_4_;
  auVar21 = vfmadd231ps_fma(auVar118,auVar117,auVar112);
  auVar102 = vfmadd231ps_fma(auVar121,auVar117,auVar123);
  auVar101 = vfmadd231ps_fma(auVar111,auVar116,auVar117);
  auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar214,auVar114);
  auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar214,auVar125);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar115,auVar214);
  auVar215._4_4_ = fVar178;
  auVar215._0_4_ = fVar178;
  auVar215._8_4_ = fVar178;
  auVar215._12_4_ = fVar178;
  auVar215._16_4_ = fVar178;
  auVar215._20_4_ = fVar178;
  auVar215._24_4_ = fVar178;
  auVar215._28_4_ = fVar178;
  auVar111 = ZEXT1632(CONCAT412(fVar186 * auVar104._12_4_,
                                CONCAT48(fVar186 * auVar104._8_4_,
                                         CONCAT44(fVar186 * auVar104._4_4_,fVar178))));
  auVar121 = vpermps_avx2(auVar216,auVar111);
  auVar111 = vpermps_avx512vl(auVar109,auVar111);
  fVar186 = auVar111._0_4_;
  fVar159 = auVar111._4_4_;
  auVar117._4_4_ = fVar159 * auVar124._4_4_;
  auVar117._0_4_ = fVar186 * auVar124._0_4_;
  fVar199 = auVar111._8_4_;
  auVar117._8_4_ = fVar199 * auVar124._8_4_;
  fVar200 = auVar111._12_4_;
  auVar117._12_4_ = fVar200 * auVar124._12_4_;
  fVar179 = auVar111._16_4_;
  auVar117._16_4_ = fVar179 * auVar124._16_4_;
  fVar185 = auVar111._20_4_;
  auVar117._20_4_ = fVar185 * auVar124._20_4_;
  fVar97 = auVar111._24_4_;
  auVar117._24_4_ = fVar97 * auVar124._24_4_;
  auVar117._28_4_ = 1;
  auVar109._4_4_ = auVar113._4_4_ * fVar159;
  auVar109._0_4_ = auVar113._0_4_ * fVar186;
  auVar109._8_4_ = auVar113._8_4_ * fVar199;
  auVar109._12_4_ = auVar113._12_4_ * fVar200;
  auVar109._16_4_ = auVar113._16_4_ * fVar179;
  auVar109._20_4_ = auVar113._20_4_ * fVar185;
  auVar109._24_4_ = auVar113._24_4_ * fVar97;
  auVar109._28_4_ = auVar124._28_4_;
  auVar113._4_4_ = auVar122._4_4_ * fVar159;
  auVar113._0_4_ = auVar122._0_4_ * fVar186;
  auVar113._8_4_ = auVar122._8_4_ * fVar199;
  auVar113._12_4_ = auVar122._12_4_ * fVar200;
  auVar113._16_4_ = auVar122._16_4_ * fVar179;
  auVar113._20_4_ = auVar122._20_4_ * fVar185;
  auVar113._24_4_ = auVar122._24_4_ * fVar97;
  auVar113._28_4_ = auVar111._28_4_;
  auVar99 = vfmadd231ps_fma(auVar117,auVar121,auVar112);
  auVar106 = vfmadd231ps_fma(auVar109,auVar121,auVar123);
  auVar223 = vfmadd231ps_fma(auVar113,auVar121,auVar116);
  auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar215,auVar114);
  auVar106 = vfmadd231ps_fma(ZEXT1632(auVar106),auVar215,auVar125);
  auVar206._8_4_ = 0x7fffffff;
  auVar206._0_8_ = 0x7fffffff7fffffff;
  auVar206._12_4_ = 0x7fffffff;
  auVar206._16_4_ = 0x7fffffff;
  auVar206._20_4_ = 0x7fffffff;
  auVar206._24_4_ = 0x7fffffff;
  auVar206._28_4_ = 0x7fffffff;
  auVar223 = vfmadd231ps_fma(ZEXT1632(auVar223),auVar215,auVar115);
  auVar114 = vandps_avx(ZEXT1632(auVar21),auVar206);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar203._16_4_ = 0x219392ef;
  auVar203._20_4_ = 0x219392ef;
  auVar203._24_4_ = 0x219392ef;
  auVar203._28_4_ = 0x219392ef;
  uVar94 = vcmpps_avx512vl(auVar114,auVar203,1);
  bVar14 = (bool)((byte)uVar94 & 1);
  auVar110._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._0_4_;
  bVar14 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar110._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._4_4_;
  bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar110._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._8_4_;
  bVar14 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar110._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar21._12_4_;
  auVar110._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar110._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar110._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar110._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(ZEXT1632(auVar102),auVar206);
  uVar94 = vcmpps_avx512vl(auVar114,auVar203,1);
  bVar14 = (bool)((byte)uVar94 & 1);
  auVar119._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._0_4_;
  bVar14 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar119._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._4_4_;
  bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar119._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._8_4_;
  bVar14 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar119._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar102._12_4_;
  auVar119._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar119._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar119._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar119._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar114 = vandps_avx(ZEXT1632(auVar101),auVar206);
  uVar94 = vcmpps_avx512vl(auVar114,auVar203,1);
  bVar14 = (bool)((byte)uVar94 & 1);
  auVar114._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._0_4_;
  bVar14 = (bool)((byte)(uVar94 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._4_4_;
  bVar14 = (bool)((byte)(uVar94 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._8_4_;
  bVar14 = (bool)((byte)(uVar94 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar101._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar94 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar94 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar94 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar94 >> 7) * 0x219392ef;
  auVar112 = vrcp14ps_avx512vl(auVar110);
  auVar204._8_4_ = 0x3f800000;
  auVar204._0_8_ = &DAT_3f8000003f800000;
  auVar204._12_4_ = 0x3f800000;
  auVar204._16_4_ = 0x3f800000;
  auVar204._20_4_ = 0x3f800000;
  auVar204._24_4_ = 0x3f800000;
  auVar204._28_4_ = 0x3f800000;
  auVar21 = vfnmadd213ps_fma(auVar110,auVar112,auVar204);
  auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar112,auVar112);
  auVar112 = vrcp14ps_avx512vl(auVar119);
  auVar102 = vfnmadd213ps_fma(auVar119,auVar112,auVar204);
  auVar102 = vfmadd132ps_fma(ZEXT1632(auVar102),auVar112,auVar112);
  auVar112 = vrcp14ps_avx512vl(auVar114);
  auVar101 = vfnmadd213ps_fma(auVar114,auVar112,auVar204);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar112,auVar112);
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 7 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar99));
  auVar115._4_4_ = auVar21._4_4_ * auVar114._4_4_;
  auVar115._0_4_ = auVar21._0_4_ * auVar114._0_4_;
  auVar115._8_4_ = auVar21._8_4_ * auVar114._8_4_;
  auVar115._12_4_ = auVar21._12_4_ * auVar114._12_4_;
  auVar115._16_4_ = auVar114._16_4_ * 0.0;
  auVar115._20_4_ = auVar114._20_4_ * 0.0;
  auVar115._24_4_ = auVar114._24_4_ * 0.0;
  auVar115._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 9 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar99));
  auVar113 = vpbroadcastd_avx512vl();
  auVar112 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar8 * 0x10 + 6));
  auVar138._0_4_ = auVar21._0_4_ * auVar114._0_4_;
  auVar138._4_4_ = auVar21._4_4_ * auVar114._4_4_;
  auVar138._8_4_ = auVar21._8_4_ * auVar114._8_4_;
  auVar138._12_4_ = auVar21._12_4_ * auVar114._12_4_;
  auVar138._16_4_ = auVar114._16_4_ * 0.0;
  auVar138._20_4_ = auVar114._20_4_ * 0.0;
  auVar138._24_4_ = auVar114._24_4_ * 0.0;
  auVar138._28_4_ = 0;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar8 * 0x10 + uVar96 * -2 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar106));
  auVar116._4_4_ = auVar102._4_4_ * auVar114._4_4_;
  auVar116._0_4_ = auVar102._0_4_ * auVar114._0_4_;
  auVar116._8_4_ = auVar102._8_4_ * auVar114._8_4_;
  auVar116._12_4_ = auVar102._12_4_ * auVar114._12_4_;
  auVar116._16_4_ = auVar114._16_4_ * 0.0;
  auVar116._20_4_ = auVar114._20_4_ * 0.0;
  auVar116._24_4_ = auVar114._24_4_ * 0.0;
  auVar116._28_4_ = auVar114._28_4_;
  auVar205 = ZEXT3264(auVar116);
  auVar114 = vcvtdq2ps_avx(auVar112);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar106));
  auVar137._0_4_ = auVar102._0_4_ * auVar114._0_4_;
  auVar137._4_4_ = auVar102._4_4_ * auVar114._4_4_;
  auVar137._8_4_ = auVar102._8_4_ * auVar114._8_4_;
  auVar137._12_4_ = auVar102._12_4_ * auVar114._12_4_;
  auVar137._16_4_ = auVar114._16_4_ * 0.0;
  auVar137._20_4_ = auVar114._20_4_ * 0.0;
  auVar137._24_4_ = auVar114._24_4_ * 0.0;
  auVar137._28_4_ = 0;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar88 + uVar96 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar223));
  auVar122._4_4_ = auVar114._4_4_ * auVar101._4_4_;
  auVar122._0_4_ = auVar114._0_4_ * auVar101._0_4_;
  auVar122._8_4_ = auVar114._8_4_ * auVar101._8_4_;
  auVar122._12_4_ = auVar114._12_4_ * auVar101._12_4_;
  auVar122._16_4_ = auVar114._16_4_ * 0.0;
  auVar122._20_4_ = auVar114._20_4_ * 0.0;
  auVar122._24_4_ = auVar114._24_4_ * 0.0;
  auVar122._28_4_ = auVar114._28_4_;
  auVar114 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar96 * 0x17 + 6));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar114 = vsubps_avx(auVar114,ZEXT1632(auVar223));
  auVar120._0_4_ = auVar101._0_4_ * auVar114._0_4_;
  auVar120._4_4_ = auVar101._4_4_ * auVar114._4_4_;
  auVar120._8_4_ = auVar101._8_4_ * auVar114._8_4_;
  auVar120._12_4_ = auVar101._12_4_ * auVar114._12_4_;
  auVar120._16_4_ = auVar114._16_4_ * 0.0;
  auVar120._20_4_ = auVar114._20_4_ * 0.0;
  auVar120._24_4_ = auVar114._24_4_ * 0.0;
  auVar120._28_4_ = 0;
  auVar114 = vpminsd_avx2(auVar115,auVar138);
  auVar112 = vpminsd_avx2(auVar116,auVar137);
  auVar114 = vmaxps_avx(auVar114,auVar112);
  auVar112 = vpminsd_avx2(auVar122,auVar120);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar124._4_4_ = uVar3;
  auVar124._0_4_ = uVar3;
  auVar124._8_4_ = uVar3;
  auVar124._12_4_ = uVar3;
  auVar124._16_4_ = uVar3;
  auVar124._20_4_ = uVar3;
  auVar124._24_4_ = uVar3;
  auVar124._28_4_ = uVar3;
  auVar112 = vmaxps_avx512vl(auVar112,auVar124);
  auVar114 = vmaxps_avx(auVar114,auVar112);
  auVar112._8_4_ = 0x3f7ffffa;
  auVar112._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar112._12_4_ = 0x3f7ffffa;
  auVar112._16_4_ = 0x3f7ffffa;
  auVar112._20_4_ = 0x3f7ffffa;
  auVar112._24_4_ = 0x3f7ffffa;
  auVar112._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar114,auVar112);
  auVar184 = ZEXT3264(local_80);
  auVar114 = vpmaxsd_avx2(auVar115,auVar138);
  auVar112 = vpmaxsd_avx2(auVar116,auVar137);
  auVar114 = vminps_avx(auVar114,auVar112);
  auVar112 = vpmaxsd_avx2(auVar122,auVar120);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar125._4_4_ = uVar3;
  auVar125._0_4_ = uVar3;
  auVar125._8_4_ = uVar3;
  auVar125._12_4_ = uVar3;
  auVar125._16_4_ = uVar3;
  auVar125._20_4_ = uVar3;
  auVar125._24_4_ = uVar3;
  auVar125._28_4_ = uVar3;
  auVar112 = vminps_avx512vl(auVar112,auVar125);
  auVar114 = vminps_avx(auVar114,auVar112);
  auVar123._8_4_ = 0x3f800003;
  auVar123._0_8_ = 0x3f8000033f800003;
  auVar123._12_4_ = 0x3f800003;
  auVar123._16_4_ = 0x3f800003;
  auVar123._20_4_ = 0x3f800003;
  auVar123._24_4_ = 0x3f800003;
  auVar123._28_4_ = 0x3f800003;
  auVar114 = vmulps_avx512vl(auVar114,auVar123);
  uVar22 = vpcmpgtd_avx512vl(auVar113,_DAT_0205a920);
  uVar161 = vcmpps_avx512vl(local_80,auVar114,2);
  if ((byte)((byte)uVar161 & (byte)uVar22) != 0) {
    uVar94 = (ulong)(byte)((byte)uVar161 & (byte)uVar22);
    local_410 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_660 = pre;
    do {
      auVar112 = auVar205._0_32_;
      auVar114 = auVar184._0_32_;
      local_580 = in_ZMM21._0_32_;
      local_560 = in_ZMM20._0_32_;
      lVar23 = 0;
      for (uVar88 = uVar94; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar94 = uVar94 - 1 & uVar94;
      uVar3 = *(undefined4 *)(prim + lVar23 * 4 + 6);
      uVar88 = (ulong)(uint)((int)lVar23 << 6);
      uVar93 = *(uint *)(prim + 2);
      pGVar11 = (context->scene->geometries).items[uVar93].ptr;
      auVar21 = *(undefined1 (*) [16])(prim + uVar88 + lVar75 + 0x16);
      if (uVar94 != 0) {
        uVar91 = uVar94 - 1 & uVar94;
        for (uVar96 = uVar94; (uVar96 & 1) == 0; uVar96 = uVar96 >> 1 | 0x8000000000000000) {
        }
        if (uVar91 != 0) {
          for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_5d0 = *(undefined1 (*) [16])(prim + uVar88 + lVar75 + 0x26);
      local_5e0 = *(undefined1 (*) [16])(prim + uVar88 + lVar75 + 0x36);
      _local_5f0 = *(undefined1 (*) [16])(prim + uVar88 + lVar75 + 0x46);
      local_4c0 = (uint)pGVar11;
      uStack_4bc = (uint)((ulong)pGVar11 >> 0x20);
      iVar9 = (int)pGVar11[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar102 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c);
      auVar102 = vinsertps_avx(auVar102,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar99 = vsubps_avx512vl(auVar21,auVar102);
      uVar160 = auVar99._0_4_;
      auVar103._4_4_ = uVar160;
      auVar103._0_4_ = uVar160;
      auVar103._8_4_ = uVar160;
      auVar103._12_4_ = uVar160;
      auVar101 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      aVar4 = pre->ray_space[k].vx.field_0;
      aVar5 = pre->ray_space[k].vy.field_0;
      fVar186 = pre->ray_space[k].vz.field_0.m128[0];
      fVar159 = pre->ray_space[k].vz.field_0.m128[1];
      fVar199 = pre->ray_space[k].vz.field_0.m128[2];
      fVar200 = pre->ray_space[k].vz.field_0.m128[3];
      auVar209._0_4_ = fVar186 * auVar99._0_4_;
      auVar209._4_4_ = fVar159 * auVar99._4_4_;
      auVar209._8_4_ = fVar199 * auVar99._8_4_;
      auVar209._12_4_ = fVar200 * auVar99._12_4_;
      auVar101 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar5,auVar101);
      auVar106 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar4,auVar103);
      auVar100 = vshufps_avx512vl(auVar21,auVar21,0xff);
      auVar99 = vsubps_avx(local_5d0,auVar102);
      uVar160 = auVar99._0_4_;
      auVar180._4_4_ = uVar160;
      auVar180._0_4_ = uVar160;
      auVar180._8_4_ = uVar160;
      auVar180._12_4_ = uVar160;
      auVar101 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar105._0_4_ = fVar186 * auVar99._0_4_;
      auVar105._4_4_ = fVar159 * auVar99._4_4_;
      auVar105._8_4_ = fVar199 * auVar99._8_4_;
      auVar105._12_4_ = fVar200 * auVar99._12_4_;
      auVar101 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar5,auVar101);
      auVar223 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar4,auVar180);
      auVar99 = vsubps_avx512vl(local_5e0,auVar102);
      uVar160 = auVar99._0_4_;
      auVar181._4_4_ = uVar160;
      auVar181._0_4_ = uVar160;
      auVar181._8_4_ = uVar160;
      auVar181._12_4_ = uVar160;
      auVar101 = vshufps_avx(auVar99,auVar99,0x55);
      auVar99 = vshufps_avx(auVar99,auVar99,0xaa);
      auVar211._0_4_ = fVar186 * auVar99._0_4_;
      auVar211._4_4_ = fVar159 * auVar99._4_4_;
      auVar211._8_4_ = fVar199 * auVar99._8_4_;
      auVar211._12_4_ = fVar200 * auVar99._12_4_;
      auVar101 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar5,auVar101);
      auVar99 = vfmadd231ps_fma(auVar101,(undefined1  [16])aVar4,auVar181);
      auVar101 = vsubps_avx512vl(_local_5f0,auVar102);
      uVar160 = auVar101._0_4_;
      auVar104._4_4_ = uVar160;
      auVar104._0_4_ = uVar160;
      auVar104._8_4_ = uVar160;
      auVar104._12_4_ = uVar160;
      auVar102 = vshufps_avx(auVar101,auVar101,0x55);
      auVar101 = vshufps_avx(auVar101,auVar101,0xaa);
      auVar212._0_4_ = fVar186 * auVar101._0_4_;
      auVar212._4_4_ = fVar159 * auVar101._4_4_;
      auVar212._8_4_ = fVar199 * auVar101._8_4_;
      auVar212._12_4_ = fVar200 * auVar101._12_4_;
      auVar102 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar102);
      auVar6 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar4,auVar104);
      lVar23 = (long)iVar9 * 0x44;
      auVar124 = *(undefined1 (*) [32])(bspline_basis0 + lVar23);
      uVar160 = auVar106._0_4_;
      local_460._4_4_ = uVar160;
      local_460._0_4_ = uVar160;
      local_460._8_4_ = uVar160;
      local_460._12_4_ = uVar160;
      local_460._16_4_ = uVar160;
      local_460._20_4_ = uVar160;
      local_460._24_4_ = uVar160;
      local_460._28_4_ = uVar160;
      auVar173._8_4_ = 1;
      auVar173._0_8_ = 0x100000001;
      auVar173._12_4_ = 1;
      auVar173._16_4_ = 1;
      auVar173._20_4_ = 1;
      auVar173._24_4_ = 1;
      auVar173._28_4_ = 1;
      local_480 = vpermps_avx512vl(auVar173,ZEXT1632(auVar106));
      auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x484);
      local_620 = vbroadcastss_avx512vl(auVar223);
      local_200 = vpermps_avx2(auVar173,ZEXT1632(auVar223));
      auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x908);
      local_a0 = vbroadcastss_avx512vl(auVar99);
      local_c0 = vpermps_avx512vl(auVar173,ZEXT1632(auVar99));
      auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0xd8c);
      local_5a0 = vbroadcastss_avx512vl(auVar6);
      auVar225 = ZEXT3264(local_5a0);
      local_5c0 = vpermps_avx512vl(auVar173,ZEXT1632(auVar6));
      auVar226 = ZEXT3264(local_5c0);
      auVar115 = vmulps_avx512vl(local_5a0,auVar113);
      auVar116 = vmulps_avx512vl(local_5c0,auVar113);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar123,local_a0);
      auVar116 = vfmadd231ps_avx512vl(auVar116,auVar123,local_c0);
      auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,local_620);
      auVar102 = vfmadd231ps_fma(auVar116,auVar125,local_200);
      auVar111 = vfmadd231ps_avx512vl(auVar115,auVar124,local_460);
      auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),auVar124,local_480);
      auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar23);
      auVar116 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x484);
      auVar122 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x908);
      auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0xd8c);
      auVar118 = vmulps_avx512vl(local_5a0,auVar121);
      auVar109 = vmulps_avx512vl(local_5c0,auVar121);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar122,local_a0);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar122,local_c0);
      auVar118 = vfmadd231ps_avx512vl(auVar118,auVar116,local_620);
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar116,local_200);
      auVar7 = vfmadd231ps_fma(auVar118,auVar115,local_460);
      auVar118 = vfmadd231ps_avx512vl(auVar109,auVar115,local_480);
      local_440 = vsubps_avx512vl(ZEXT1632(auVar7),auVar111);
      local_4a0 = vsubps_avx(auVar118,auVar117);
      auVar109 = vmulps_avx512vl(auVar117,local_440);
      auVar110 = vmulps_avx512vl(auVar111,local_4a0);
      auVar109 = vsubps_avx512vl(auVar109,auVar110);
      auVar102 = vshufps_avx(local_5d0,local_5d0,0xff);
      uVar161 = auVar100._0_8_;
      local_e0._8_8_ = uVar161;
      local_e0._0_8_ = uVar161;
      local_e0._16_8_ = uVar161;
      local_e0._24_8_ = uVar161;
      local_100 = vbroadcastsd_avx512vl(auVar102);
      auVar102 = vshufps_avx512vl(local_5e0,local_5e0,0xff);
      local_120 = vbroadcastsd_avx512vl(auVar102);
      auVar102 = vshufps_avx512vl(_local_5f0,_local_5f0,0xff);
      uVar161 = auVar102._0_8_;
      register0x00001248 = uVar161;
      local_140 = uVar161;
      register0x00001250 = uVar161;
      register0x00001258 = uVar161;
      auVar110 = vmulps_avx512vl(_local_140,auVar113);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar123,local_120);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar125,local_100);
      auVar110 = vfmadd231ps_avx512vl(auVar110,auVar124,local_e0);
      auVar119 = vmulps_avx512vl(_local_140,auVar121);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar122,local_120);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar116,local_100);
      auVar100 = vfmadd231ps_fma(auVar119,auVar115,local_e0);
      auVar119 = vmulps_avx512vl(local_4a0,local_4a0);
      auVar119 = vfmadd231ps_avx512vl(auVar119,local_440,local_440);
      auVar120 = vmaxps_avx512vl(auVar110,ZEXT1632(auVar100));
      auVar120 = vmulps_avx512vl(auVar120,auVar120);
      auVar119 = vmulps_avx512vl(auVar120,auVar119);
      auVar109 = vmulps_avx512vl(auVar109,auVar109);
      uVar161 = vcmpps_avx512vl(auVar109,auVar119,2);
      auVar102 = vblendps_avx(auVar106,auVar21,8);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar101 = vandps_avx512vl(auVar102,auVar103);
      auVar102 = vblendps_avx(auVar223,local_5d0,8);
      auVar102 = vandps_avx512vl(auVar102,auVar103);
      auVar101 = vmaxps_avx(auVar101,auVar102);
      auVar102 = vblendps_avx(auVar99,local_5e0,8);
      auVar104 = vandps_avx512vl(auVar102,auVar103);
      auVar102 = vblendps_avx(auVar6,_local_5f0,8);
      auVar102 = vandps_avx512vl(auVar102,auVar103);
      auVar102 = vmaxps_avx(auVar104,auVar102);
      auVar102 = vmaxps_avx(auVar101,auVar102);
      auVar101 = vmovshdup_avx(auVar102);
      auVar101 = vmaxss_avx(auVar101,auVar102);
      auVar102 = vshufpd_avx(auVar102,auVar102,1);
      auVar102 = vmaxss_avx(auVar102,auVar101);
      local_600 = vcvtsi2ss_avx512f(_local_5f0,iVar9);
      auVar213._0_4_ = local_600._0_4_;
      auVar213._4_4_ = auVar213._0_4_;
      auVar213._8_4_ = auVar213._0_4_;
      auVar213._12_4_ = auVar213._0_4_;
      auVar213._16_4_ = auVar213._0_4_;
      auVar213._20_4_ = auVar213._0_4_;
      auVar213._24_4_ = auVar213._0_4_;
      auVar213._28_4_ = auVar213._0_4_;
      uVar22 = vcmpps_avx512vl(auVar213,_DAT_02020f40,0xe);
      bVar95 = (byte)uVar161 & (byte)uVar22;
      auVar102 = vmulss_avx512f(auVar102,ZEXT416(0x35000000));
      auVar182._8_4_ = 2;
      auVar182._0_8_ = 0x200000002;
      auVar182._12_4_ = 2;
      auVar182._16_4_ = 2;
      auVar182._20_4_ = 2;
      auVar182._24_4_ = 2;
      auVar182._28_4_ = 2;
      local_160 = vpermps_avx512vl(auVar182,ZEXT1632(auVar106));
      local_180 = vpermps_avx512vl(auVar182,ZEXT1632(auVar223));
      local_1a0 = vpermps_avx512vl(auVar182,ZEXT1632(auVar99));
      local_1c0 = vpermps_avx2(auVar182,ZEXT1632(auVar6));
      uVar208 = *(uint *)(ray + k * 4 + 0x30);
      auVar101 = local_440._0_16_;
      if (bVar95 == 0) {
        auVar101 = vxorps_avx512vl(auVar101,auVar101);
        auVar224 = ZEXT1664(auVar101);
        auVar205 = ZEXT3264(auVar112);
        in_ZMM20 = ZEXT3264(local_560);
        auVar184 = ZEXT3264(auVar114);
        in_ZMM21 = ZEXT3264(local_580);
        auVar222 = ZEXT3264(local_460);
        auVar220 = ZEXT3264(local_480);
        auVar219 = ZEXT3264(local_620);
      }
      else {
        _local_4e0 = ZEXT416(uVar208);
        auVar121 = vmulps_avx512vl(local_1c0,auVar121);
        auVar122 = vfmadd213ps_avx512vl(auVar122,local_1a0,auVar121);
        auVar116 = vfmadd213ps_avx512vl(auVar116,local_180,auVar122);
        auVar116 = vfmadd213ps_avx512vl(auVar115,local_160,auVar116);
        auVar113 = vmulps_avx512vl(local_1c0,auVar113);
        auVar123 = vfmadd213ps_avx512vl(auVar123,local_1a0,auVar113);
        auVar122 = vfmadd213ps_avx512vl(auVar125,local_180,auVar123);
        auVar125 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1210);
        auVar123 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1694);
        auVar113 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(bspline_basis0 + lVar23 + 0x1f9c);
        auVar122 = vfmadd213ps_avx512vl(auVar124,local_160,auVar122);
        auVar124 = vmulps_avx512vl(local_5a0,auVar115);
        auVar121 = vmulps_avx512vl(local_5c0,auVar115);
        auVar115 = vmulps_avx512vl(local_1c0,auVar115);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar113,local_a0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar113,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar115,local_1a0,auVar113);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar123,local_620);
        auVar99 = vfmadd231ps_fma(auVar121,auVar123,local_200);
        auVar115 = vfmadd231ps_avx512vl(auVar113,local_180,auVar123);
        auVar121 = vfmadd231ps_avx512vl(auVar124,auVar125,local_460);
        auVar220 = ZEXT3264(local_480);
        auVar109 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar125,local_480);
        auVar124 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1210);
        auVar123 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1b18);
        auVar113 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1f9c);
        auVar115 = vfmadd231ps_avx512vl(auVar115,local_160,auVar125);
        auVar125 = vmulps_avx512vl(local_5a0,auVar113);
        auVar119 = vmulps_avx512vl(local_5c0,auVar113);
        auVar113 = vmulps_avx512vl(local_1c0,auVar113);
        auVar120 = vfmadd231ps_avx512vl(auVar125,auVar123,local_a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar123,local_c0);
        auVar123 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar123);
        auVar125 = *(undefined1 (*) [32])(bspline_basis1 + lVar23 + 0x1694);
        auVar113 = vfmadd231ps_avx512vl(auVar120,auVar125,local_620);
        auVar99 = vfmadd231ps_fma(auVar119,auVar125,local_200);
        auVar125 = vfmadd231ps_avx512vl(auVar123,local_180,auVar125);
        auVar123 = vfmadd231ps_avx512vl(auVar113,auVar124,local_460);
        auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar124,local_480);
        auVar119 = vfmadd231ps_avx512vl(auVar125,local_160,auVar124);
        auVar217._8_4_ = 0x7fffffff;
        auVar217._0_8_ = 0x7fffffff7fffffff;
        auVar217._12_4_ = 0x7fffffff;
        auVar217._16_4_ = 0x7fffffff;
        auVar217._20_4_ = 0x7fffffff;
        auVar217._24_4_ = 0x7fffffff;
        auVar217._28_4_ = 0x7fffffff;
        auVar124 = vandps_avx(auVar121,auVar217);
        auVar125 = vandps_avx(auVar109,auVar217);
        auVar125 = vmaxps_avx(auVar124,auVar125);
        auVar124 = vandps_avx(auVar115,auVar217);
        auVar124 = vmaxps_avx(auVar125,auVar124);
        auVar115 = vbroadcastss_avx512vl(auVar102);
        uVar88 = vcmpps_avx512vl(auVar124,auVar115,1);
        bVar14 = (bool)((byte)uVar88 & 1);
        auVar126._0_4_ = (float)((uint)bVar14 * local_440._0_4_ | (uint)!bVar14 * auVar121._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar126._4_4_ = (float)((uint)bVar14 * local_440._4_4_ | (uint)!bVar14 * auVar121._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar126._8_4_ = (float)((uint)bVar14 * local_440._8_4_ | (uint)!bVar14 * auVar121._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar126._12_4_ = (float)((uint)bVar14 * local_440._12_4_ | (uint)!bVar14 * auVar121._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar126._16_4_ = (float)((uint)bVar14 * local_440._16_4_ | (uint)!bVar14 * auVar121._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar126._20_4_ = (float)((uint)bVar14 * local_440._20_4_ | (uint)!bVar14 * auVar121._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar126._24_4_ = (float)((uint)bVar14 * local_440._24_4_ | (uint)!bVar14 * auVar121._24_4_)
        ;
        bVar14 = SUB81(uVar88 >> 7,0);
        auVar126._28_4_ = (uint)bVar14 * local_440._28_4_ | (uint)!bVar14 * auVar121._28_4_;
        bVar14 = (bool)((byte)uVar88 & 1);
        auVar127._0_4_ = (float)((uint)bVar14 * local_4a0._0_4_ | (uint)!bVar14 * auVar109._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar127._4_4_ = (float)((uint)bVar14 * local_4a0._4_4_ | (uint)!bVar14 * auVar109._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar127._8_4_ = (float)((uint)bVar14 * local_4a0._8_4_ | (uint)!bVar14 * auVar109._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar127._12_4_ = (float)((uint)bVar14 * local_4a0._12_4_ | (uint)!bVar14 * auVar109._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar127._16_4_ = (float)((uint)bVar14 * local_4a0._16_4_ | (uint)!bVar14 * auVar109._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar127._20_4_ = (float)((uint)bVar14 * local_4a0._20_4_ | (uint)!bVar14 * auVar109._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar127._24_4_ = (float)((uint)bVar14 * local_4a0._24_4_ | (uint)!bVar14 * auVar109._24_4_)
        ;
        bVar14 = SUB81(uVar88 >> 7,0);
        auVar127._28_4_ = (uint)bVar14 * local_4a0._28_4_ | (uint)!bVar14 * auVar109._28_4_;
        auVar124 = vandps_avx(auVar217,auVar123);
        auVar125 = vandps_avx(auVar113,auVar217);
        auVar125 = vmaxps_avx(auVar124,auVar125);
        auVar124 = vandps_avx(auVar119,auVar217);
        auVar124 = vmaxps_avx(auVar125,auVar124);
        uVar88 = vcmpps_avx512vl(auVar124,auVar115,1);
        bVar14 = (bool)((byte)uVar88 & 1);
        auVar128._0_4_ = (float)((uint)bVar14 * local_440._0_4_ | (uint)!bVar14 * auVar123._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar128._4_4_ = (float)((uint)bVar14 * local_440._4_4_ | (uint)!bVar14 * auVar123._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar128._8_4_ = (float)((uint)bVar14 * local_440._8_4_ | (uint)!bVar14 * auVar123._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar128._12_4_ = (float)((uint)bVar14 * local_440._12_4_ | (uint)!bVar14 * auVar123._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar128._16_4_ = (float)((uint)bVar14 * local_440._16_4_ | (uint)!bVar14 * auVar123._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar128._20_4_ = (float)((uint)bVar14 * local_440._20_4_ | (uint)!bVar14 * auVar123._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar128._24_4_ = (float)((uint)bVar14 * local_440._24_4_ | (uint)!bVar14 * auVar123._24_4_)
        ;
        bVar14 = SUB81(uVar88 >> 7,0);
        auVar128._28_4_ = (uint)bVar14 * local_440._28_4_ | (uint)!bVar14 * auVar123._28_4_;
        bVar14 = (bool)((byte)uVar88 & 1);
        auVar129._0_4_ = (float)((uint)bVar14 * local_4a0._0_4_ | (uint)!bVar14 * auVar113._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar129._4_4_ = (float)((uint)bVar14 * local_4a0._4_4_ | (uint)!bVar14 * auVar113._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar129._8_4_ = (float)((uint)bVar14 * local_4a0._8_4_ | (uint)!bVar14 * auVar113._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar129._12_4_ = (float)((uint)bVar14 * local_4a0._12_4_ | (uint)!bVar14 * auVar113._12_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar129._16_4_ = (float)((uint)bVar14 * local_4a0._16_4_ | (uint)!bVar14 * auVar113._16_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar129._20_4_ = (float)((uint)bVar14 * local_4a0._20_4_ | (uint)!bVar14 * auVar113._20_4_)
        ;
        bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar129._24_4_ = (float)((uint)bVar14 * local_4a0._24_4_ | (uint)!bVar14 * auVar113._24_4_)
        ;
        bVar14 = SUB81(uVar88 >> 7,0);
        auVar129._28_4_ = (uint)bVar14 * local_4a0._28_4_ | (uint)!bVar14 * auVar113._28_4_;
        auVar105 = vxorps_avx512vl(auVar101,auVar101);
        auVar224 = ZEXT1664(auVar105);
        auVar124 = vfmadd213ps_avx512vl(auVar126,auVar126,ZEXT1632(auVar105));
        auVar101 = vfmadd231ps_fma(auVar124,auVar127,auVar127);
        auVar124 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
        fVar186 = auVar124._0_4_;
        fVar159 = auVar124._4_4_;
        fVar199 = auVar124._8_4_;
        fVar200 = auVar124._12_4_;
        fVar179 = auVar124._16_4_;
        fVar185 = auVar124._20_4_;
        fVar97 = auVar124._24_4_;
        auVar39._4_4_ = fVar159 * fVar159 * fVar159 * auVar101._4_4_ * -0.5;
        auVar39._0_4_ = fVar186 * fVar186 * fVar186 * auVar101._0_4_ * -0.5;
        auVar39._8_4_ = fVar199 * fVar199 * fVar199 * auVar101._8_4_ * -0.5;
        auVar39._12_4_ = fVar200 * fVar200 * fVar200 * auVar101._12_4_ * -0.5;
        auVar39._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
        auVar39._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar39._24_4_ = fVar97 * fVar97 * fVar97 * -0.0;
        auVar39._28_4_ = 0;
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar123 = vfmadd231ps_avx512vl(auVar39,auVar125,auVar124);
        auVar40._4_4_ = auVar127._4_4_ * auVar123._4_4_;
        auVar40._0_4_ = auVar127._0_4_ * auVar123._0_4_;
        auVar40._8_4_ = auVar127._8_4_ * auVar123._8_4_;
        auVar40._12_4_ = auVar127._12_4_ * auVar123._12_4_;
        auVar40._16_4_ = auVar127._16_4_ * auVar123._16_4_;
        auVar40._20_4_ = auVar127._20_4_ * auVar123._20_4_;
        auVar40._24_4_ = auVar127._24_4_ * auVar123._24_4_;
        auVar40._28_4_ = auVar124._28_4_;
        auVar41._4_4_ = auVar123._4_4_ * -auVar126._4_4_;
        auVar41._0_4_ = auVar123._0_4_ * -auVar126._0_4_;
        auVar41._8_4_ = auVar123._8_4_ * -auVar126._8_4_;
        auVar41._12_4_ = auVar123._12_4_ * -auVar126._12_4_;
        auVar41._16_4_ = auVar123._16_4_ * -auVar126._16_4_;
        auVar41._20_4_ = auVar123._20_4_ * -auVar126._20_4_;
        auVar41._24_4_ = auVar123._24_4_ * -auVar126._24_4_;
        auVar41._28_4_ = auVar126._28_4_ ^ 0x80000000;
        auVar124 = vmulps_avx512vl(auVar123,ZEXT1632(auVar105));
        auVar109 = ZEXT1632(auVar105);
        auVar113 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar109);
        auVar101 = vfmadd231ps_fma(auVar113,auVar129,auVar129);
        auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar101));
        fVar186 = auVar113._0_4_;
        fVar159 = auVar113._4_4_;
        fVar199 = auVar113._8_4_;
        fVar200 = auVar113._12_4_;
        fVar179 = auVar113._16_4_;
        fVar185 = auVar113._20_4_;
        fVar97 = auVar113._24_4_;
        auVar42._4_4_ = fVar159 * fVar159 * fVar159 * auVar101._4_4_ * -0.5;
        auVar42._0_4_ = fVar186 * fVar186 * fVar186 * auVar101._0_4_ * -0.5;
        auVar42._8_4_ = fVar199 * fVar199 * fVar199 * auVar101._8_4_ * -0.5;
        auVar42._12_4_ = fVar200 * fVar200 * fVar200 * auVar101._12_4_ * -0.5;
        auVar42._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
        auVar42._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
        auVar42._24_4_ = fVar97 * fVar97 * fVar97 * -0.0;
        auVar42._28_4_ = 0;
        auVar125 = vfmadd231ps_avx512vl(auVar42,auVar125,auVar113);
        auVar43._4_4_ = auVar129._4_4_ * auVar125._4_4_;
        auVar43._0_4_ = auVar129._0_4_ * auVar125._0_4_;
        auVar43._8_4_ = auVar129._8_4_ * auVar125._8_4_;
        auVar43._12_4_ = auVar129._12_4_ * auVar125._12_4_;
        auVar43._16_4_ = auVar129._16_4_ * auVar125._16_4_;
        auVar43._20_4_ = auVar129._20_4_ * auVar125._20_4_;
        auVar43._24_4_ = auVar129._24_4_ * auVar125._24_4_;
        auVar43._28_4_ = auVar113._28_4_;
        auVar44._4_4_ = -auVar128._4_4_ * auVar125._4_4_;
        auVar44._0_4_ = -auVar128._0_4_ * auVar125._0_4_;
        auVar44._8_4_ = -auVar128._8_4_ * auVar125._8_4_;
        auVar44._12_4_ = -auVar128._12_4_ * auVar125._12_4_;
        auVar44._16_4_ = -auVar128._16_4_ * auVar125._16_4_;
        auVar44._20_4_ = -auVar128._20_4_ * auVar125._20_4_;
        auVar44._24_4_ = -auVar128._24_4_ * auVar125._24_4_;
        auVar44._28_4_ = auVar123._28_4_;
        auVar125 = vmulps_avx512vl(auVar125,auVar109);
        auVar101 = vfmadd213ps_fma(auVar40,auVar110,auVar111);
        auVar99 = vfmadd213ps_fma(auVar41,auVar110,auVar117);
        auVar123 = vfmadd213ps_avx512vl(auVar124,auVar110,auVar122);
        auVar113 = vfmadd213ps_avx512vl(auVar43,ZEXT1632(auVar100),ZEXT1632(auVar7));
        auVar103 = vfnmadd213ps_fma(auVar40,auVar110,auVar111);
        auVar121 = ZEXT1632(auVar100);
        auVar106 = vfmadd213ps_fma(auVar44,auVar121,auVar118);
        auVar104 = vfnmadd213ps_fma(auVar41,auVar110,auVar117);
        auVar223 = vfmadd213ps_fma(auVar125,auVar121,auVar116);
        auVar115 = vfnmadd231ps_avx512vl(auVar122,auVar110,auVar124);
        auVar180 = vfnmadd213ps_fma(auVar43,auVar121,ZEXT1632(auVar7));
        auVar181 = vfnmadd213ps_fma(auVar44,auVar121,auVar118);
        auVar209 = vfnmadd231ps_fma(auVar116,ZEXT1632(auVar100),auVar125);
        auVar125 = vsubps_avx512vl(auVar113,ZEXT1632(auVar103));
        auVar124 = vsubps_avx(ZEXT1632(auVar106),ZEXT1632(auVar104));
        auVar116 = vsubps_avx512vl(ZEXT1632(auVar223),auVar115);
        auVar122 = vmulps_avx512vl(auVar124,auVar115);
        auVar6 = vfmsub231ps_fma(auVar122,ZEXT1632(auVar104),auVar116);
        auVar45._4_4_ = auVar103._4_4_ * auVar116._4_4_;
        auVar45._0_4_ = auVar103._0_4_ * auVar116._0_4_;
        auVar45._8_4_ = auVar103._8_4_ * auVar116._8_4_;
        auVar45._12_4_ = auVar103._12_4_ * auVar116._12_4_;
        auVar45._16_4_ = auVar116._16_4_ * 0.0;
        auVar45._20_4_ = auVar116._20_4_ * 0.0;
        auVar45._24_4_ = auVar116._24_4_ * 0.0;
        auVar45._28_4_ = auVar116._28_4_;
        auVar116 = vfmsub231ps_avx512vl(auVar45,auVar115,auVar125);
        auVar46._4_4_ = auVar104._4_4_ * auVar125._4_4_;
        auVar46._0_4_ = auVar104._0_4_ * auVar125._0_4_;
        auVar46._8_4_ = auVar104._8_4_ * auVar125._8_4_;
        auVar46._12_4_ = auVar104._12_4_ * auVar125._12_4_;
        auVar46._16_4_ = auVar125._16_4_ * 0.0;
        auVar46._20_4_ = auVar125._20_4_ * 0.0;
        auVar46._24_4_ = auVar125._24_4_ * 0.0;
        auVar46._28_4_ = auVar125._28_4_;
        auVar7 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar103),auVar124);
        auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar109,auVar116);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar109,ZEXT1632(auVar6));
        auVar109 = ZEXT1632(auVar105);
        uVar88 = vcmpps_avx512vl(auVar124,auVar109,2);
        bVar87 = (byte)uVar88;
        fVar97 = (float)((uint)(bVar87 & 1) * auVar101._0_4_ |
                        (uint)!(bool)(bVar87 & 1) * auVar180._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar178 = (float)((uint)bVar14 * auVar101._4_4_ | (uint)!bVar14 * auVar180._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar152 = (float)((uint)bVar14 * auVar101._8_4_ | (uint)!bVar14 * auVar180._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar155 = (float)((uint)bVar14 * auVar101._12_4_ | (uint)!bVar14 * auVar180._12_4_);
        auVar122 = ZEXT1632(CONCAT412(fVar155,CONCAT48(fVar152,CONCAT44(fVar178,fVar97))));
        fVar98 = (float)((uint)(bVar87 & 1) * auVar99._0_4_ |
                        (uint)!(bool)(bVar87 & 1) * auVar181._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        fVar151 = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar181._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        fVar153 = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar181._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        fVar156 = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar181._12_4_);
        auVar121 = ZEXT1632(CONCAT412(fVar156,CONCAT48(fVar153,CONCAT44(fVar151,fVar98))));
        auVar130._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar123._0_4_ |
                    (uint)!(bool)(bVar87 & 1) * auVar209._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar130._4_4_ = (float)((uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar209._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar130._8_4_ = (float)((uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar209._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar130._12_4_ = (float)((uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar209._12_4_);
        fVar186 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar123._16_4_);
        auVar130._16_4_ = fVar186;
        fVar159 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar123._20_4_);
        auVar130._20_4_ = fVar159;
        fVar199 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar123._24_4_);
        auVar130._24_4_ = fVar199;
        iVar1 = (uint)(byte)(uVar88 >> 7) * auVar123._28_4_;
        auVar130._28_4_ = iVar1;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar103),auVar113);
        auVar131._0_4_ =
             (uint)(bVar87 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar6._0_4_;
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar6._4_4_;
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar6._8_4_;
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar6._12_4_;
        auVar131._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_;
        auVar131._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_;
        auVar131._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_;
        auVar131._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar106));
        auVar132._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar99._0_4_
                    );
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar132._4_4_ = (float)((uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar99._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar132._8_4_ = (float)((uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar99._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar132._12_4_ = (float)((uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar99._12_4_);
        fVar200 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar125._16_4_);
        auVar132._16_4_ = fVar200;
        fVar179 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar125._20_4_);
        auVar132._20_4_ = fVar179;
        fVar185 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar125._24_4_);
        auVar132._24_4_ = fVar185;
        auVar132._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar125._28_4_;
        auVar125 = vblendmps_avx512vl(auVar115,ZEXT1632(auVar223));
        auVar133._0_4_ =
             (float)((uint)(bVar87 & 1) * auVar125._0_4_ |
                    (uint)!(bool)(bVar87 & 1) * auVar123._0_4_);
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar133._4_4_ = (float)((uint)bVar14 * auVar125._4_4_ | (uint)!bVar14 * auVar123._4_4_);
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar133._8_4_ = (float)((uint)bVar14 * auVar125._8_4_ | (uint)!bVar14 * auVar123._8_4_);
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar133._12_4_ = (float)((uint)bVar14 * auVar125._12_4_ | (uint)!bVar14 * auVar123._12_4_);
        bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
        auVar133._16_4_ = (float)((uint)bVar14 * auVar125._16_4_ | (uint)!bVar14 * auVar123._16_4_);
        bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
        auVar133._20_4_ = (float)((uint)bVar14 * auVar125._20_4_ | (uint)!bVar14 * auVar123._20_4_);
        bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
        auVar133._24_4_ = (float)((uint)bVar14 * auVar125._24_4_ | (uint)!bVar14 * auVar123._24_4_);
        bVar14 = SUB81(uVar88 >> 7,0);
        auVar133._28_4_ = (uint)bVar14 * auVar125._28_4_ | (uint)!bVar14 * auVar123._28_4_;
        auVar134._0_4_ =
             (uint)(bVar87 & 1) * (int)auVar103._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar113._0_4_;
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar14 * (int)auVar103._4_4_ | (uint)!bVar14 * auVar113._4_4_;
        bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar14 * (int)auVar103._8_4_ | (uint)!bVar14 * auVar113._8_4_;
        bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar14 * (int)auVar103._12_4_ | (uint)!bVar14 * auVar113._12_4_;
        auVar134._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar113._16_4_;
        auVar134._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar113._20_4_;
        auVar134._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar113._24_4_;
        auVar134._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar113._28_4_;
        bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar135._0_4_ =
             (uint)(bVar87 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar87 & 1) * auVar223._0_4_;
        bVar15 = (bool)((byte)(uVar88 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar15 * auVar115._4_4_ | (uint)!bVar15 * auVar223._4_4_;
        bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar15 * auVar115._8_4_ | (uint)!bVar15 * auVar223._8_4_;
        bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar15 * auVar115._12_4_ | (uint)!bVar15 * auVar223._12_4_;
        auVar135._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar115._16_4_;
        auVar135._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar115._20_4_;
        auVar135._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar115._24_4_;
        iVar2 = (uint)(byte)(uVar88 >> 7) * auVar115._28_4_;
        auVar135._28_4_ = iVar2;
        auVar111 = vsubps_avx512vl(auVar134,auVar122);
        auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar104._12_4_ |
                                                 (uint)!bVar17 * auVar106._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar104._8_4_ |
                                                          (uint)!bVar16 * auVar106._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar104._4_4_ |
                                                                   (uint)!bVar14 * auVar106._4_4_,
                                                                   (uint)(bVar87 & 1) *
                                                                   (int)auVar104._0_4_ |
                                                                   (uint)!(bool)(bVar87 & 1) *
                                                                   auVar106._0_4_)))),auVar121);
        auVar123 = vsubps_avx(auVar135,auVar130);
        auVar113 = vsubps_avx(auVar122,auVar131);
        auVar115 = vsubps_avx(auVar121,auVar132);
        auVar116 = vsubps_avx(auVar130,auVar133);
        auVar47._4_4_ = auVar123._4_4_ * fVar178;
        auVar47._0_4_ = auVar123._0_4_ * fVar97;
        auVar47._8_4_ = auVar123._8_4_ * fVar152;
        auVar47._12_4_ = auVar123._12_4_ * fVar155;
        auVar47._16_4_ = auVar123._16_4_ * 0.0;
        auVar47._20_4_ = auVar123._20_4_ * 0.0;
        auVar47._24_4_ = auVar123._24_4_ * 0.0;
        auVar47._28_4_ = iVar2;
        auVar101 = vfmsub231ps_fma(auVar47,auVar130,auVar111);
        auVar48._4_4_ = fVar151 * auVar111._4_4_;
        auVar48._0_4_ = fVar98 * auVar111._0_4_;
        auVar48._8_4_ = fVar153 * auVar111._8_4_;
        auVar48._12_4_ = fVar156 * auVar111._12_4_;
        auVar48._16_4_ = auVar111._16_4_ * 0.0;
        auVar48._20_4_ = auVar111._20_4_ * 0.0;
        auVar48._24_4_ = auVar111._24_4_ * 0.0;
        auVar48._28_4_ = auVar124._28_4_;
        auVar99 = vfmsub231ps_fma(auVar48,auVar122,auVar125);
        auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar109,ZEXT1632(auVar101));
        auVar195._0_4_ = auVar125._0_4_ * auVar130._0_4_;
        auVar195._4_4_ = auVar125._4_4_ * auVar130._4_4_;
        auVar195._8_4_ = auVar125._8_4_ * auVar130._8_4_;
        auVar195._12_4_ = auVar125._12_4_ * auVar130._12_4_;
        auVar195._16_4_ = auVar125._16_4_ * fVar186;
        auVar195._20_4_ = auVar125._20_4_ * fVar159;
        auVar195._24_4_ = auVar125._24_4_ * fVar199;
        auVar195._28_4_ = 0;
        auVar101 = vfmsub231ps_fma(auVar195,auVar121,auVar123);
        auVar117 = vfmadd231ps_avx512vl(auVar124,auVar109,ZEXT1632(auVar101));
        auVar124 = vmulps_avx512vl(auVar116,auVar131);
        auVar124 = vfmsub231ps_avx512vl(auVar124,auVar113,auVar133);
        auVar49._4_4_ = auVar115._4_4_ * auVar133._4_4_;
        auVar49._0_4_ = auVar115._0_4_ * auVar133._0_4_;
        auVar49._8_4_ = auVar115._8_4_ * auVar133._8_4_;
        auVar49._12_4_ = auVar115._12_4_ * auVar133._12_4_;
        auVar49._16_4_ = auVar115._16_4_ * auVar133._16_4_;
        auVar49._20_4_ = auVar115._20_4_ * auVar133._20_4_;
        auVar49._24_4_ = auVar115._24_4_ * auVar133._24_4_;
        auVar49._28_4_ = auVar133._28_4_;
        auVar101 = vfmsub231ps_fma(auVar49,auVar132,auVar116);
        auVar196._0_4_ = auVar132._0_4_ * auVar113._0_4_;
        auVar196._4_4_ = auVar132._4_4_ * auVar113._4_4_;
        auVar196._8_4_ = auVar132._8_4_ * auVar113._8_4_;
        auVar196._12_4_ = auVar132._12_4_ * auVar113._12_4_;
        auVar196._16_4_ = fVar200 * auVar113._16_4_;
        auVar196._20_4_ = fVar179 * auVar113._20_4_;
        auVar196._24_4_ = fVar185 * auVar113._24_4_;
        auVar196._28_4_ = 0;
        auVar99 = vfmsub231ps_fma(auVar196,auVar115,auVar131);
        auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar109,auVar124);
        auVar118 = vfmadd231ps_avx512vl(auVar124,auVar109,ZEXT1632(auVar101));
        auVar124 = vmaxps_avx(auVar117,auVar118);
        uVar161 = vcmpps_avx512vl(auVar124,auVar109,2);
        bVar95 = bVar95 & (byte)uVar161;
        in_ZMM20 = ZEXT3264(local_560);
        in_ZMM21 = ZEXT3264(local_580);
        auVar222 = ZEXT3264(local_460);
        auVar219 = ZEXT3264(local_620);
        if (bVar95 == 0) {
          bVar95 = 0;
          auVar205 = ZEXT3264(auVar112);
          auVar184 = ZEXT3264(auVar114);
        }
        else {
          auVar50._4_4_ = auVar116._4_4_ * auVar125._4_4_;
          auVar50._0_4_ = auVar116._0_4_ * auVar125._0_4_;
          auVar50._8_4_ = auVar116._8_4_ * auVar125._8_4_;
          auVar50._12_4_ = auVar116._12_4_ * auVar125._12_4_;
          auVar50._16_4_ = auVar116._16_4_ * auVar125._16_4_;
          auVar50._20_4_ = auVar116._20_4_ * auVar125._20_4_;
          auVar50._24_4_ = auVar116._24_4_ * auVar125._24_4_;
          auVar50._28_4_ = auVar124._28_4_;
          auVar106 = vfmsub231ps_fma(auVar50,auVar115,auVar123);
          auVar51._4_4_ = auVar123._4_4_ * auVar113._4_4_;
          auVar51._0_4_ = auVar123._0_4_ * auVar113._0_4_;
          auVar51._8_4_ = auVar123._8_4_ * auVar113._8_4_;
          auVar51._12_4_ = auVar123._12_4_ * auVar113._12_4_;
          auVar51._16_4_ = auVar123._16_4_ * auVar113._16_4_;
          auVar51._20_4_ = auVar123._20_4_ * auVar113._20_4_;
          auVar51._24_4_ = auVar123._24_4_ * auVar113._24_4_;
          auVar51._28_4_ = auVar123._28_4_;
          auVar99 = vfmsub231ps_fma(auVar51,auVar111,auVar116);
          auVar52._4_4_ = auVar115._4_4_ * auVar111._4_4_;
          auVar52._0_4_ = auVar115._0_4_ * auVar111._0_4_;
          auVar52._8_4_ = auVar115._8_4_ * auVar111._8_4_;
          auVar52._12_4_ = auVar115._12_4_ * auVar111._12_4_;
          auVar52._16_4_ = auVar115._16_4_ * auVar111._16_4_;
          auVar52._20_4_ = auVar115._20_4_ * auVar111._20_4_;
          auVar52._24_4_ = auVar115._24_4_ * auVar111._24_4_;
          auVar52._28_4_ = auVar115._28_4_;
          auVar223 = vfmsub231ps_fma(auVar52,auVar113,auVar125);
          auVar101 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar223));
          auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar101),ZEXT1632(auVar106),auVar109);
          auVar125 = vrcp14ps_avx512vl(auVar124);
          auVar28._8_4_ = 0x3f800000;
          auVar28._0_8_ = &DAT_3f8000003f800000;
          auVar28._12_4_ = 0x3f800000;
          auVar28._16_4_ = 0x3f800000;
          auVar28._20_4_ = 0x3f800000;
          auVar28._24_4_ = 0x3f800000;
          auVar28._28_4_ = 0x3f800000;
          auVar123 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar28);
          auVar101 = vfmadd132ps_fma(auVar123,auVar125,auVar125);
          auVar53._4_4_ = auVar223._4_4_ * auVar130._4_4_;
          auVar53._0_4_ = auVar223._0_4_ * auVar130._0_4_;
          auVar53._8_4_ = auVar223._8_4_ * auVar130._8_4_;
          auVar53._12_4_ = auVar223._12_4_ * auVar130._12_4_;
          auVar53._16_4_ = fVar186 * 0.0;
          auVar53._20_4_ = fVar159 * 0.0;
          auVar53._24_4_ = fVar199 * 0.0;
          auVar53._28_4_ = iVar1;
          auVar99 = vfmadd231ps_fma(auVar53,auVar121,ZEXT1632(auVar99));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar122,ZEXT1632(auVar106));
          fVar186 = auVar101._0_4_;
          fVar159 = auVar101._4_4_;
          fVar199 = auVar101._8_4_;
          fVar200 = auVar101._12_4_;
          auVar125 = ZEXT1632(CONCAT412(auVar99._12_4_ * fVar200,
                                        CONCAT48(auVar99._8_4_ * fVar199,
                                                 CONCAT44(auVar99._4_4_ * fVar159,
                                                          auVar99._0_4_ * fVar186))));
          auVar207._4_4_ = uVar208;
          auVar207._0_4_ = uVar208;
          auVar207._8_4_ = uVar208;
          auVar207._12_4_ = uVar208;
          auVar207._16_4_ = uVar208;
          auVar207._20_4_ = uVar208;
          auVar207._24_4_ = uVar208;
          auVar207._28_4_ = uVar208;
          uVar161 = vcmpps_avx512vl(auVar207,auVar125,2);
          uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar29._4_4_ = uVar160;
          auVar29._0_4_ = uVar160;
          auVar29._8_4_ = uVar160;
          auVar29._12_4_ = uVar160;
          auVar29._16_4_ = uVar160;
          auVar29._20_4_ = uVar160;
          auVar29._24_4_ = uVar160;
          auVar29._28_4_ = uVar160;
          uVar22 = vcmpps_avx512vl(auVar125,auVar29,2);
          bVar95 = (byte)uVar161 & (byte)uVar22 & bVar95;
          if (bVar95 == 0) {
            bVar95 = 0;
            auVar205 = ZEXT3264(auVar112);
            auVar184 = ZEXT3264(auVar114);
          }
          else {
            uVar161 = vcmpps_avx512vl(auVar124,auVar109,4);
            if ((bVar95 & (byte)uVar161) == 0) {
              bVar95 = 0;
              auVar205 = ZEXT3264(auVar112);
              auVar184 = ZEXT3264(auVar114);
            }
            else {
              bVar95 = bVar95 & (byte)uVar161;
              fVar179 = auVar117._0_4_ * fVar186;
              fVar185 = auVar117._4_4_ * fVar159;
              auVar54._4_4_ = fVar185;
              auVar54._0_4_ = fVar179;
              fVar97 = auVar117._8_4_ * fVar199;
              auVar54._8_4_ = fVar97;
              fVar98 = auVar117._12_4_ * fVar200;
              auVar54._12_4_ = fVar98;
              fVar178 = auVar117._16_4_ * 0.0;
              auVar54._16_4_ = fVar178;
              fVar151 = auVar117._20_4_ * 0.0;
              auVar54._20_4_ = fVar151;
              fVar152 = auVar117._24_4_ * 0.0;
              auVar54._24_4_ = fVar152;
              auVar54._28_4_ = auVar117._28_4_;
              fVar186 = auVar118._0_4_ * fVar186;
              fVar159 = auVar118._4_4_ * fVar159;
              auVar55._4_4_ = fVar159;
              auVar55._0_4_ = fVar186;
              fVar199 = auVar118._8_4_ * fVar199;
              auVar55._8_4_ = fVar199;
              fVar200 = auVar118._12_4_ * fVar200;
              auVar55._12_4_ = fVar200;
              fVar153 = auVar118._16_4_ * 0.0;
              auVar55._16_4_ = fVar153;
              fVar155 = auVar118._20_4_ * 0.0;
              auVar55._20_4_ = fVar155;
              fVar156 = auVar118._24_4_ * 0.0;
              auVar55._24_4_ = fVar156;
              auVar55._28_4_ = auVar118._28_4_;
              auVar201._8_4_ = 0x3f800000;
              auVar201._0_8_ = &DAT_3f8000003f800000;
              auVar201._12_4_ = 0x3f800000;
              auVar201._16_4_ = 0x3f800000;
              auVar201._20_4_ = 0x3f800000;
              auVar201._24_4_ = 0x3f800000;
              auVar201._28_4_ = 0x3f800000;
              auVar114 = vsubps_avx(auVar201,auVar54);
              bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar88 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar88 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar88 >> 6) & 1);
              bVar20 = SUB81(uVar88 >> 7,0);
              auVar205 = ZEXT3264(CONCAT428((uint)bVar20 * auVar117._28_4_ |
                                            (uint)!bVar20 * auVar114._28_4_,
                                            CONCAT424((uint)bVar19 * (int)fVar152 |
                                                      (uint)!bVar19 * auVar114._24_4_,
                                                      CONCAT420((uint)bVar18 * (int)fVar151 |
                                                                (uint)!bVar18 * auVar114._20_4_,
                                                                CONCAT416((uint)bVar17 *
                                                                          (int)fVar178 |
                                                                          (uint)!bVar17 *
                                                                          auVar114._16_4_,
                                                                          CONCAT412((uint)bVar16 *
                                                                                    (int)fVar98 |
                                                                                    (uint)!bVar16 *
                                                                                    auVar114._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar15 * (int)fVar97 |
                                                  (uint)!bVar15 * auVar114._8_4_,
                                                  CONCAT44((uint)bVar14 * (int)fVar185 |
                                                           (uint)!bVar14 * auVar114._4_4_,
                                                           (uint)(bVar87 & 1) * (int)fVar179 |
                                                           (uint)!(bool)(bVar87 & 1) *
                                                           auVar114._0_4_))))))));
              auVar114 = vsubps_avx(auVar201,auVar55);
              bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
              bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
              bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
              bVar17 = (bool)((byte)(uVar88 >> 4) & 1);
              bVar18 = (bool)((byte)(uVar88 >> 5) & 1);
              bVar19 = (bool)((byte)(uVar88 >> 6) & 1);
              bVar20 = SUB81(uVar88 >> 7,0);
              local_220._4_4_ = (uint)bVar14 * (int)fVar159 | (uint)!bVar14 * auVar114._4_4_;
              local_220._0_4_ =
                   (uint)(bVar87 & 1) * (int)fVar186 | (uint)!(bool)(bVar87 & 1) * auVar114._0_4_;
              local_220._8_4_ = (uint)bVar15 * (int)fVar199 | (uint)!bVar15 * auVar114._8_4_;
              local_220._12_4_ = (uint)bVar16 * (int)fVar200 | (uint)!bVar16 * auVar114._12_4_;
              local_220._16_4_ = (uint)bVar17 * (int)fVar153 | (uint)!bVar17 * auVar114._16_4_;
              local_220._20_4_ = (uint)bVar18 * (int)fVar155 | (uint)!bVar18 * auVar114._20_4_;
              local_220._24_4_ = (uint)bVar19 * (int)fVar156 | (uint)!bVar19 * auVar114._24_4_;
              local_220._28_4_ = (uint)bVar20 * auVar118._28_4_ | (uint)!bVar20 * auVar114._28_4_;
              auVar184 = ZEXT3264(auVar125);
            }
          }
        }
        auVar226 = ZEXT3264(local_5c0);
        auVar225 = ZEXT3264(local_5a0);
        if (bVar95 != 0) {
          auVar114 = vsubps_avx(ZEXT1632(auVar100),auVar110);
          auVar124 = auVar205._0_32_;
          auVar101 = vfmadd213ps_fma(auVar114,auVar124,auVar110);
          uVar160 = *(undefined4 *)((long)local_660->ray_space + k * 4 + -0x10);
          auVar30._4_4_ = uVar160;
          auVar30._0_4_ = uVar160;
          auVar30._8_4_ = uVar160;
          auVar30._12_4_ = uVar160;
          auVar30._16_4_ = uVar160;
          auVar30._20_4_ = uVar160;
          auVar30._24_4_ = uVar160;
          auVar30._28_4_ = uVar160;
          auVar114 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar101._12_4_ + auVar101._12_4_,
                                                        CONCAT48(auVar101._8_4_ + auVar101._8_4_,
                                                                 CONCAT44(auVar101._4_4_ +
                                                                          auVar101._4_4_,
                                                                          auVar101._0_4_ +
                                                                          auVar101._0_4_)))),auVar30
                                    );
          auVar112 = auVar184._0_32_;
          uVar161 = vcmpps_avx512vl(auVar112,auVar114,6);
          bVar95 = bVar95 & (byte)uVar161;
          if (bVar95 != 0) {
            auVar166._8_4_ = 0xbf800000;
            auVar166._0_8_ = 0xbf800000bf800000;
            auVar166._12_4_ = 0xbf800000;
            auVar166._16_4_ = 0xbf800000;
            auVar166._20_4_ = 0xbf800000;
            auVar166._24_4_ = 0xbf800000;
            auVar166._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_3e0 = vfmadd132ps_avx512vl(local_220,auVar166,auVar31);
            local_220 = local_3e0;
            auVar114 = local_220;
            local_3a0 = 0;
            local_380 = local_5d0._0_8_;
            uStack_378 = local_5d0._8_8_;
            local_370 = local_5e0._0_8_;
            uStack_368 = local_5e0._8_8_;
            local_360 = local_5f0;
            uStack_358 = uStack_5e8;
            local_220 = auVar114;
            if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar186 = 1.0 / auVar213._0_4_;
              local_340[0] = fVar186 * (auVar205._0_4_ + 0.0);
              local_340[1] = fVar186 * (auVar205._4_4_ + 1.0);
              local_340[2] = fVar186 * (auVar205._8_4_ + 2.0);
              local_340[3] = fVar186 * (auVar205._12_4_ + 3.0);
              fStack_330 = fVar186 * (auVar205._16_4_ + 4.0);
              fStack_32c = fVar186 * (auVar205._20_4_ + 5.0);
              fStack_328 = fVar186 * (auVar205._24_4_ + 6.0);
              fStack_324 = auVar205._28_4_ + 7.0;
              local_220._0_8_ = local_3e0._0_8_;
              local_220._8_8_ = local_3e0._8_8_;
              local_220._16_8_ = local_3e0._16_8_;
              local_220._24_8_ = local_3e0._24_8_;
              local_320 = local_220._0_8_;
              uStack_318 = local_220._8_8_;
              uStack_310 = local_220._16_8_;
              uStack_308 = local_220._24_8_;
              local_300 = auVar112;
              auVar167._8_4_ = 0x7f800000;
              auVar167._0_8_ = 0x7f8000007f800000;
              auVar167._12_4_ = 0x7f800000;
              auVar167._16_4_ = 0x7f800000;
              auVar167._20_4_ = 0x7f800000;
              auVar167._24_4_ = 0x7f800000;
              auVar167._28_4_ = 0x7f800000;
              auVar114 = vblendmps_avx512vl(auVar167,auVar112);
              auVar136._0_4_ =
                   (uint)(bVar95 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar95 & 1) * 0x7f800000;
              bVar14 = (bool)(bVar95 >> 1 & 1);
              auVar136._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar95 >> 2 & 1);
              auVar136._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar95 >> 3 & 1);
              auVar136._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar95 >> 4 & 1);
              auVar136._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar95 >> 5 & 1);
              auVar136._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * 0x7f800000;
              bVar14 = (bool)(bVar95 >> 6 & 1);
              auVar136._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * 0x7f800000;
              auVar136._28_4_ =
                   (uint)(bVar95 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
              auVar114 = vshufps_avx(auVar136,auVar136,0xb1);
              auVar114 = vminps_avx(auVar136,auVar114);
              auVar125 = vshufpd_avx(auVar114,auVar114,5);
              auVar114 = vminps_avx(auVar114,auVar125);
              auVar125 = vpermpd_avx2(auVar114,0x4e);
              auVar114 = vminps_avx(auVar114,auVar125);
              uVar161 = vcmpps_avx512vl(auVar136,auVar114,0);
              bVar86 = (byte)uVar161 & bVar95;
              bVar87 = bVar95;
              if (bVar86 != 0) {
                bVar87 = bVar86;
              }
              uVar90 = 0;
              for (uVar89 = (uint)bVar87; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000) {
                uVar90 = uVar90 + 1;
              }
              uVar88 = (ulong)uVar90;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar186 = local_340[uVar88];
                uVar160 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                fVar159 = 1.0 - fVar186;
                auVar24._8_4_ = 0x80000000;
                auVar24._0_8_ = 0x8000000080000000;
                auVar24._12_4_ = 0x80000000;
                auVar106 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar24);
                auVar101 = ZEXT416((uint)(fVar186 * fVar159 * 4.0));
                auVar99 = vfnmsub213ss_fma(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),auVar101);
                auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),auVar101);
                fVar159 = fVar159 * auVar106._0_4_ * 0.5;
                fVar199 = auVar99._0_4_ * 0.5;
                fVar200 = auVar101._0_4_ * 0.5;
                fVar179 = fVar186 * fVar186 * 0.5;
                auVar187._0_4_ = fVar179 * (float)local_5f0._0_4_;
                auVar187._4_4_ = fVar179 * (float)local_5f0._4_4_;
                auVar187._8_4_ = fVar179 * (float)uStack_5e8;
                auVar187._12_4_ = fVar179 * uStack_5e8._4_4_;
                auVar174._4_4_ = fVar200;
                auVar174._0_4_ = fVar200;
                auVar174._8_4_ = fVar200;
                auVar174._12_4_ = fVar200;
                auVar101 = vfmadd132ps_fma(auVar174,auVar187,local_5e0);
                auVar188._4_4_ = fVar199;
                auVar188._0_4_ = fVar199;
                auVar188._8_4_ = fVar199;
                auVar188._12_4_ = fVar199;
                auVar205 = ZEXT3264(auVar124);
                auVar101 = vfmadd132ps_fma(auVar188,auVar101,local_5d0);
                auVar175._4_4_ = fVar159;
                auVar175._0_4_ = fVar159;
                auVar175._8_4_ = fVar159;
                auVar175._12_4_ = fVar159;
                auVar101 = vfmadd213ps_fma(auVar175,auVar21,auVar101);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                auVar184 = ZEXT3264(auVar112);
                *(int *)(ray + k * 4 + 0xc0) = auVar101._0_4_;
                uVar10 = vextractps_avx(auVar101,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                uVar10 = vextractps_avx(auVar101,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                *(float *)(ray + k * 4 + 0xf0) = fVar186;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar160;
                *(undefined4 *)(ray + k * 4 + 0x110) = uVar3;
                *(uint *)(ray + k * 4 + 0x120) = uVar93;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_4f0 = vpbroadcastd_avx512vl();
                local_500 = vpbroadcastd_avx512vl();
                local_510 = local_5d0._0_4_;
                uStack_50c = local_5d0._4_4_;
                uStack_508 = local_5d0._8_8_;
                local_520 = local_5e0._0_8_;
                uStack_518 = local_5e0._8_8_;
                local_530 = (float)local_5f0._0_4_;
                fStack_52c = (float)local_5f0._4_4_;
                fStack_528 = (float)uStack_5e8;
                fStack_524 = uStack_5e8._4_4_;
                local_400 = auVar124;
                local_3c0 = auVar112;
                local_39c = iVar9;
                local_390 = auVar21;
                local_350 = bVar95;
                do {
                  auVar223 = auVar224._0_16_;
                  local_440._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar186 = local_340[uVar88];
                  local_2a0._4_4_ = fVar186;
                  local_2a0._0_4_ = fVar186;
                  local_2a0._8_4_ = fVar186;
                  local_2a0._12_4_ = fVar186;
                  local_290 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                  local_658.context = context->user;
                  fVar159 = 1.0 - fVar186;
                  auVar27._8_4_ = 0x80000000;
                  auVar27._0_8_ = 0x8000000080000000;
                  auVar27._12_4_ = 0x80000000;
                  auVar106 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar27);
                  auVar101 = ZEXT416((uint)(fVar186 * fVar159 * 4.0));
                  auVar99 = vfnmsub213ss_fma(local_2a0,local_2a0,auVar101);
                  auVar101 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),auVar101)
                  ;
                  fVar159 = fVar159 * auVar106._0_4_ * 0.5;
                  fVar199 = auVar99._0_4_ * 0.5;
                  fVar200 = auVar101._0_4_ * 0.5;
                  fVar186 = fVar186 * fVar186 * 0.5;
                  auVar193._0_4_ = fVar186 * local_530;
                  auVar193._4_4_ = fVar186 * fStack_52c;
                  auVar193._8_4_ = fVar186 * fStack_528;
                  auVar193._12_4_ = fVar186 * fStack_524;
                  auVar164._4_4_ = fVar200;
                  auVar164._0_4_ = fVar200;
                  auVar164._8_4_ = fVar200;
                  auVar164._12_4_ = fVar200;
                  auVar83._8_8_ = uStack_518;
                  auVar83._0_8_ = local_520;
                  auVar101 = vfmadd132ps_fma(auVar164,auVar193,auVar83);
                  auVar194._4_4_ = fVar199;
                  auVar194._0_4_ = fVar199;
                  auVar194._8_4_ = fVar199;
                  auVar194._12_4_ = fVar199;
                  auVar84._4_4_ = uStack_50c;
                  auVar84._0_4_ = local_510;
                  auVar84._8_8_ = uStack_508;
                  auVar101 = vfmadd132ps_fma(auVar194,auVar101,auVar84);
                  auVar165._4_4_ = fVar159;
                  auVar165._0_4_ = fVar159;
                  auVar165._8_4_ = fVar159;
                  auVar165._12_4_ = fVar159;
                  auVar101 = vfmadd213ps_fma(auVar165,auVar21,auVar101);
                  local_2d0 = auVar101._0_4_;
                  local_2c0 = vshufps_avx(auVar101,auVar101,0x55);
                  local_2b0 = vshufps_avx(auVar101,auVar101,0xaa);
                  iStack_2cc = local_2d0;
                  iStack_2c8 = local_2d0;
                  iStack_2c4 = local_2d0;
                  uStack_28c = local_290;
                  uStack_288 = local_290;
                  uStack_284 = local_290;
                  local_280 = local_500._0_8_;
                  uStack_278 = local_500._8_8_;
                  local_270 = local_4f0;
                  vpcmpeqd_avx2(ZEXT1632(local_4f0),ZEXT1632(local_4f0));
                  uStack_25c = (local_658.context)->instID[0];
                  local_260 = uStack_25c;
                  uStack_258 = uStack_25c;
                  uStack_254 = uStack_25c;
                  uStack_250 = (local_658.context)->instPrimID[0];
                  uStack_24c = uStack_250;
                  uStack_248 = uStack_250;
                  uStack_244 = uStack_250;
                  local_670 = local_410._0_8_;
                  uStack_668 = local_410._8_8_;
                  local_658.valid = (int *)&local_670;
                  local_658.geometryUserPtr = *(void **)(CONCAT44(uStack_4bc,local_4c0) + 0x18);
                  local_658.hit = (RTCHitN *)&local_2d0;
                  local_658.N = 4;
                  pcVar13 = *(code **)(CONCAT44(uStack_4bc,local_4c0) + 0x40);
                  local_4a0._0_8_ = uVar88;
                  local_658.ray = (RTCRayN *)ray;
                  if (pcVar13 != (code *)0x0) {
                    (*pcVar13)(&local_658);
                    auVar226 = ZEXT3264(local_5c0);
                    auVar225 = ZEXT3264(local_5a0);
                    auVar219 = ZEXT3264(local_620);
                    auVar220 = ZEXT3264(local_480);
                    auVar222 = ZEXT3264(local_460);
                    in_ZMM21 = ZEXT3264(local_580);
                    in_ZMM20 = ZEXT3264(local_560);
                    auVar101 = vxorps_avx512vl(auVar223,auVar223);
                    auVar224 = ZEXT1664(auVar101);
                    uVar88 = local_4a0._0_8_;
                    uVar208 = local_4e0._0_4_;
                  }
                  auVar101 = auVar224._0_16_;
                  auVar79._8_8_ = uStack_668;
                  auVar79._0_8_ = local_670;
                  uVar96 = vptestmd_avx512vl(auVar79,auVar79);
                  if ((uVar96 & 0xf) == 0) {
LAB_01d534f6:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_440._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_4bc,local_4c0) + 0x3e) & 0x40) != 0)))) {
                      (*p_Var12)(&local_658);
                      auVar226 = ZEXT3264(local_5c0);
                      auVar225 = ZEXT3264(local_5a0);
                      auVar219 = ZEXT3264(local_620);
                      auVar220 = ZEXT3264(local_480);
                      auVar222 = ZEXT3264(local_460);
                      in_ZMM21 = ZEXT3264(local_580);
                      in_ZMM20 = ZEXT3264(local_560);
                      auVar101 = vxorps_avx512vl(auVar101,auVar101);
                      auVar224 = ZEXT1664(auVar101);
                      uVar88 = local_4a0._0_8_;
                      uVar208 = local_4e0._0_4_;
                    }
                    auVar80._8_8_ = uStack_668;
                    auVar80._0_8_ = local_670;
                    uVar96 = vptestmd_avx512vl(auVar80,auVar80);
                    uVar96 = uVar96 & 0xf;
                    bVar87 = (byte)uVar96;
                    if (bVar87 == 0) goto LAB_01d534f6;
                    iVar1 = *(int *)(local_658.hit + 4);
                    iVar2 = *(int *)(local_658.hit + 8);
                    iVar76 = *(int *)(local_658.hit + 0xc);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = SUB81(uVar96 >> 3,0);
                    *(uint *)(local_658.ray + 0xc0) =
                         (uint)(bVar87 & 1) * *(int *)local_658.hit |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_658.ray + 0xc0);
                    *(uint *)(local_658.ray + 0xc4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xc4);
                    *(uint *)(local_658.ray + 200) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 200);
                    *(uint *)(local_658.ray + 0xcc) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xcc);
                    iVar1 = *(int *)(local_658.hit + 0x14);
                    iVar2 = *(int *)(local_658.hit + 0x18);
                    iVar76 = *(int *)(local_658.hit + 0x1c);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = SUB81(uVar96 >> 3,0);
                    *(uint *)(local_658.ray + 0xd0) =
                         (uint)(bVar87 & 1) * *(int *)(local_658.hit + 0x10) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_658.ray + 0xd0);
                    *(uint *)(local_658.ray + 0xd4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xd4);
                    *(uint *)(local_658.ray + 0xd8) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 0xd8);
                    *(uint *)(local_658.ray + 0xdc) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xdc);
                    iVar1 = *(int *)(local_658.hit + 0x24);
                    iVar2 = *(int *)(local_658.hit + 0x28);
                    iVar76 = *(int *)(local_658.hit + 0x2c);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = SUB81(uVar96 >> 3,0);
                    *(uint *)(local_658.ray + 0xe0) =
                         (uint)(bVar87 & 1) * *(int *)(local_658.hit + 0x20) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_658.ray + 0xe0);
                    *(uint *)(local_658.ray + 0xe4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xe4);
                    *(uint *)(local_658.ray + 0xe8) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 0xe8);
                    *(uint *)(local_658.ray + 0xec) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xec);
                    iVar1 = *(int *)(local_658.hit + 0x34);
                    iVar2 = *(int *)(local_658.hit + 0x38);
                    iVar76 = *(int *)(local_658.hit + 0x3c);
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                    bVar16 = SUB81(uVar96 >> 3,0);
                    *(uint *)(local_658.ray + 0xf0) =
                         (uint)(bVar87 & 1) * *(int *)(local_658.hit + 0x30) |
                         (uint)!(bool)(bVar87 & 1) * *(int *)(local_658.ray + 0xf0);
                    *(uint *)(local_658.ray + 0xf4) =
                         (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xf4);
                    *(uint *)(local_658.ray + 0xf8) =
                         (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 0xf8);
                    *(uint *)(local_658.ray + 0xfc) =
                         (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xfc);
                    auVar101 = *(undefined1 (*) [16])(local_658.ray + 0x100);
                    auVar108._0_4_ =
                         (uint)(bVar87 & 1) * *(int *)(local_658.hit + 0x40) |
                         (uint)!(bool)(bVar87 & 1) * auVar101._0_4_;
                    bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                    auVar108._4_4_ =
                         (uint)bVar14 * *(int *)(local_658.hit + 0x44) |
                         (uint)!bVar14 * auVar101._4_4_;
                    bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                    auVar108._8_4_ =
                         (uint)bVar14 * *(int *)(local_658.hit + 0x48) |
                         (uint)!bVar14 * auVar101._8_4_;
                    bVar14 = SUB81(uVar96 >> 3,0);
                    auVar108._12_4_ =
                         (uint)bVar14 * *(int *)(local_658.hit + 0x4c) |
                         (uint)!bVar14 * auVar101._12_4_;
                    *(undefined1 (*) [16])(local_658.ray + 0x100) = auVar108;
                    auVar101 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x50));
                    *(undefined1 (*) [16])(local_658.ray + 0x110) = auVar101;
                    auVar101 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x60));
                    *(undefined1 (*) [16])(local_658.ray + 0x120) = auVar101;
                    auVar101 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x70));
                    *(undefined1 (*) [16])(local_658.ray + 0x130) = auVar101;
                    auVar101 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x80));
                    *(undefined1 (*) [16])(local_658.ray + 0x140) = auVar101;
                  }
                  auVar205 = ZEXT3264(auVar124);
                  auVar184 = ZEXT3264(auVar112);
                  bVar87 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & bVar95;
                  uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar38._4_4_ = uVar160;
                  auVar38._0_4_ = uVar160;
                  auVar38._8_4_ = uVar160;
                  auVar38._12_4_ = uVar160;
                  auVar38._16_4_ = uVar160;
                  auVar38._20_4_ = uVar160;
                  auVar38._24_4_ = uVar160;
                  auVar38._28_4_ = uVar160;
                  uVar161 = vcmpps_avx512vl(auVar112,auVar38,2);
                  bVar95 = bVar87 & (byte)uVar161;
                  if ((bVar87 & (byte)uVar161) != 0) {
                    auVar172._8_4_ = 0x7f800000;
                    auVar172._0_8_ = 0x7f8000007f800000;
                    auVar172._12_4_ = 0x7f800000;
                    auVar172._16_4_ = 0x7f800000;
                    auVar172._20_4_ = 0x7f800000;
                    auVar172._24_4_ = 0x7f800000;
                    auVar172._28_4_ = 0x7f800000;
                    auVar114 = vblendmps_avx512vl(auVar172,auVar112);
                    auVar150._0_4_ =
                         (uint)(bVar95 & 1) * auVar114._0_4_ |
                         (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                    bVar14 = (bool)(bVar95 >> 1 & 1);
                    auVar150._4_4_ = (uint)bVar14 * auVar114._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar95 >> 2 & 1);
                    auVar150._8_4_ = (uint)bVar14 * auVar114._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar95 >> 3 & 1);
                    auVar150._12_4_ = (uint)bVar14 * auVar114._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar95 >> 4 & 1);
                    auVar150._16_4_ = (uint)bVar14 * auVar114._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar95 >> 5 & 1);
                    auVar150._20_4_ = (uint)bVar14 * auVar114._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)(bVar95 >> 6 & 1);
                    auVar150._24_4_ = (uint)bVar14 * auVar114._24_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar150._28_4_ =
                         (uint)(bVar95 >> 7) * auVar114._28_4_ |
                         (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
                    auVar114 = vshufps_avx(auVar150,auVar150,0xb1);
                    auVar114 = vminps_avx(auVar150,auVar114);
                    auVar125 = vshufpd_avx(auVar114,auVar114,5);
                    auVar114 = vminps_avx(auVar114,auVar125);
                    auVar125 = vpermpd_avx2(auVar114,0x4e);
                    auVar114 = vminps_avx(auVar114,auVar125);
                    uVar161 = vcmpps_avx512vl(auVar150,auVar114,0);
                    bVar86 = (byte)uVar161 & bVar95;
                    bVar87 = bVar95;
                    if (bVar86 != 0) {
                      bVar87 = bVar86;
                    }
                    uVar90 = 0;
                    for (uVar89 = (uint)bVar87; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x80000000
                        ) {
                      uVar90 = uVar90 + 1;
                    }
                    uVar88 = (ulong)uVar90;
                  }
                } while (bVar95 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar9) {
        local_4a0 = vpbroadcastd_avx512vl();
        local_440 = vbroadcastss_avx512vl(auVar102);
        fStack_4d0 = 1.0 / (float)local_600._0_4_;
        local_4e0._4_4_ = fStack_4d0;
        local_4e0._0_4_ = fStack_4d0;
        fStack_4d8 = fStack_4d0;
        fStack_4d4 = fStack_4d0;
        local_600 = vpbroadcastd_avx512vl();
        local_4f0 = vpbroadcastd_avx512vl();
        lVar92 = 8;
        auVar112 = auVar205._0_32_;
        auVar114 = auVar184._0_32_;
        fStack_4cc = fStack_4d0;
        fStack_4c8 = fStack_4d0;
        fStack_4c4 = fStack_4d0;
        local_4c0 = uVar208;
        uStack_4bc = uVar208;
        uStack_4b8 = uVar208;
        uStack_4b4 = uVar208;
        uStack_4b0 = uVar208;
        uStack_4ac = uVar208;
        uStack_4a8 = uVar208;
        uStack_4a4 = uVar208;
        do {
          auVar124 = vpbroadcastd_avx512vl();
          auVar115 = vpor_avx2(auVar124,_DAT_0205a920);
          uVar22 = vpcmpd_avx512vl(auVar115,local_4a0,1);
          auVar124 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 * 4 + lVar23);
          auVar125 = *(undefined1 (*) [32])(lVar23 + 0x222bfac + lVar92 * 4);
          auVar123 = *(undefined1 (*) [32])(lVar23 + 0x222c430 + lVar92 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar23 + 0x222c8b4 + lVar92 * 4);
          local_5a0 = auVar225._0_32_;
          auVar116 = vmulps_avx512vl(local_5a0,auVar113);
          local_5c0 = auVar226._0_32_;
          auVar122 = vmulps_avx512vl(local_5c0,auVar113);
          auVar56._4_4_ = auVar113._4_4_ * (float)local_140._4_4_;
          auVar56._0_4_ = auVar113._0_4_ * (float)local_140._0_4_;
          auVar56._8_4_ = auVar113._8_4_ * fStack_138;
          auVar56._12_4_ = auVar113._12_4_ * fStack_134;
          auVar56._16_4_ = auVar113._16_4_ * fStack_130;
          auVar56._20_4_ = auVar113._20_4_ * fStack_12c;
          auVar56._24_4_ = auVar113._24_4_ * fStack_128;
          auVar56._28_4_ = auVar115._28_4_;
          auVar115 = vfmadd231ps_avx512vl(auVar116,auVar123,local_a0);
          auVar116 = vfmadd231ps_avx512vl(auVar122,auVar123,local_c0);
          auVar122 = vfmadd231ps_avx512vl(auVar56,auVar123,local_120);
          auVar203 = auVar219._0_32_;
          auVar115 = vfmadd231ps_avx512vl(auVar115,auVar125,auVar203);
          auVar116 = vfmadd231ps_avx512vl(auVar116,auVar125,local_200);
          auVar102 = vfmadd231ps_fma(auVar122,auVar125,local_100);
          auVar206 = auVar222._0_32_;
          auVar118 = vfmadd231ps_avx512vl(auVar115,auVar124,auVar206);
          auVar204 = auVar220._0_32_;
          auVar109 = vfmadd231ps_avx512vl(auVar116,auVar124,auVar204);
          auVar115 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 * 4 + lVar23);
          auVar116 = *(undefined1 (*) [32])(lVar23 + 0x222e3cc + lVar92 * 4);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar124,local_e0);
          auVar122 = *(undefined1 (*) [32])(lVar23 + 0x222e850 + lVar92 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar23 + 0x222ecd4 + lVar92 * 4);
          auVar111 = vmulps_avx512vl(local_5a0,auVar121);
          auVar117 = vmulps_avx512vl(local_5c0,auVar121);
          auVar57._4_4_ = auVar121._4_4_ * (float)local_140._4_4_;
          auVar57._0_4_ = auVar121._0_4_ * (float)local_140._0_4_;
          auVar57._8_4_ = auVar121._8_4_ * fStack_138;
          auVar57._12_4_ = auVar121._12_4_ * fStack_134;
          auVar57._16_4_ = auVar121._16_4_ * fStack_130;
          auVar57._20_4_ = auVar121._20_4_ * fStack_12c;
          auVar57._24_4_ = auVar121._24_4_ * fStack_128;
          auVar57._28_4_ = uStack_124;
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar122,local_a0);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar122,local_c0);
          auVar110 = vfmadd231ps_avx512vl(auVar57,auVar122,local_120);
          auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,auVar203);
          auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,local_200);
          auVar101 = vfmadd231ps_fma(auVar110,auVar116,local_100);
          auVar110 = vfmadd231ps_avx512vl(auVar111,auVar115,auVar206);
          auVar119 = vfmadd231ps_avx512vl(auVar117,auVar115,auVar204);
          auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar115,local_e0);
          auVar120 = vmaxps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar101));
          auVar111 = vsubps_avx(auVar110,auVar118);
          auVar117 = vsubps_avx(auVar119,auVar109);
          auVar137 = vmulps_avx512vl(auVar109,auVar111);
          auVar138 = vmulps_avx512vl(auVar118,auVar117);
          auVar137 = vsubps_avx512vl(auVar137,auVar138);
          auVar138 = vmulps_avx512vl(auVar117,auVar117);
          auVar138 = vfmadd231ps_avx512vl(auVar138,auVar111,auVar111);
          auVar120 = vmulps_avx512vl(auVar120,auVar120);
          auVar120 = vmulps_avx512vl(auVar120,auVar138);
          auVar137 = vmulps_avx512vl(auVar137,auVar137);
          uVar161 = vcmpps_avx512vl(auVar137,auVar120,2);
          local_350 = (byte)uVar22 & (byte)uVar161;
          if (local_350 == 0) {
            auVar221 = ZEXT3264(auVar204);
            auVar219 = ZEXT3264(auVar203);
          }
          else {
            auVar121 = vmulps_avx512vl(local_1c0,auVar121);
            auVar122 = vfmadd213ps_avx512vl(auVar122,local_1a0,auVar121);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_180,auVar122);
            auVar115 = vfmadd213ps_avx512vl(auVar115,local_160,auVar116);
            auVar113 = vmulps_avx512vl(local_1c0,auVar113);
            auVar123 = vfmadd213ps_avx512vl(auVar123,local_1a0,auVar113);
            auVar125 = vfmadd213ps_avx512vl(auVar125,local_180,auVar123);
            auVar116 = vfmadd213ps_avx512vl(auVar124,local_160,auVar125);
            auVar124 = *(undefined1 (*) [32])(lVar23 + 0x222cd38 + lVar92 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar23 + 0x222d1bc + lVar92 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar23 + 0x222d640 + lVar92 * 4);
            auVar113 = *(undefined1 (*) [32])(lVar23 + 0x222dac4 + lVar92 * 4);
            auVar122 = vmulps_avx512vl(local_5a0,auVar113);
            auVar121 = vmulps_avx512vl(local_5c0,auVar113);
            auVar113 = vmulps_avx512vl(local_1c0,auVar113);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar123,local_a0);
            auVar121 = vfmadd231ps_avx512vl(auVar121,auVar123,local_c0);
            auVar123 = vfmadd231ps_avx512vl(auVar113,local_1a0,auVar123);
            auVar113 = vfmadd231ps_avx512vl(auVar122,auVar125,auVar203);
            auVar122 = vfmadd231ps_avx512vl(auVar121,auVar125,local_200);
            auVar125 = vfmadd231ps_avx512vl(auVar123,local_180,auVar125);
            auVar113 = vfmadd231ps_avx512vl(auVar113,auVar124,auVar206);
            auVar122 = vfmadd231ps_avx512vl(auVar122,auVar124,auVar204);
            auVar121 = vfmadd231ps_avx512vl(auVar125,local_160,auVar124);
            auVar124 = *(undefined1 (*) [32])(lVar23 + 0x222f158 + lVar92 * 4);
            auVar125 = *(undefined1 (*) [32])(lVar23 + 0x222fa60 + lVar92 * 4);
            auVar123 = *(undefined1 (*) [32])(lVar23 + 0x222fee4 + lVar92 * 4);
            auVar120 = vmulps_avx512vl(local_5a0,auVar123);
            auVar137 = vmulps_avx512vl(local_5c0,auVar123);
            auVar123 = vmulps_avx512vl(local_1c0,auVar123);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar125,local_a0);
            auVar137 = vfmadd231ps_avx512vl(auVar137,auVar125,local_c0);
            auVar123 = vfmadd231ps_avx512vl(auVar123,local_1a0,auVar125);
            auVar125 = *(undefined1 (*) [32])(lVar23 + 0x222f5dc + lVar92 * 4);
            auVar120 = vfmadd231ps_avx512vl(auVar120,auVar125,auVar203);
            auVar99 = vfmadd231ps_fma(auVar137,auVar125,local_200);
            auVar125 = vfmadd231ps_avx512vl(auVar123,local_180,auVar125);
            auVar123 = vfmadd231ps_avx512vl(auVar120,auVar124,auVar206);
            auVar120 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar124,auVar204);
            auVar125 = vfmadd231ps_avx512vl(auVar125,local_160,auVar124);
            auVar137 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar113,auVar137);
            vandps_avx512vl(auVar122,auVar137);
            auVar124 = vmaxps_avx(auVar137,auVar137);
            vandps_avx512vl(auVar121,auVar137);
            auVar124 = vmaxps_avx(auVar124,auVar137);
            uVar88 = vcmpps_avx512vl(auVar124,local_440,1);
            bVar14 = (bool)((byte)uVar88 & 1);
            auVar139._0_4_ = (float)((uint)bVar14 * auVar111._0_4_ | (uint)!bVar14 * auVar113._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar139._4_4_ = (float)((uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar113._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar139._8_4_ = (float)((uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar113._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar139._12_4_ =
                 (float)((uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar113._12_4_);
            bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar139._16_4_ =
                 (float)((uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * auVar113._16_4_);
            bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar139._20_4_ =
                 (float)((uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * auVar113._20_4_);
            bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar139._24_4_ =
                 (float)((uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * auVar113._24_4_);
            bVar14 = SUB81(uVar88 >> 7,0);
            auVar139._28_4_ = (uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * auVar113._28_4_;
            bVar14 = (bool)((byte)uVar88 & 1);
            auVar140._0_4_ = (float)((uint)bVar14 * auVar117._0_4_ | (uint)!bVar14 * auVar122._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar140._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar122._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar140._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar122._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar140._12_4_ =
                 (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar122._12_4_);
            bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar140._16_4_ =
                 (float)((uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * auVar122._16_4_);
            bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar140._20_4_ =
                 (float)((uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * auVar122._20_4_);
            bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar140._24_4_ =
                 (float)((uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * auVar122._24_4_);
            bVar14 = SUB81(uVar88 >> 7,0);
            auVar140._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * auVar122._28_4_;
            vandps_avx512vl(auVar123,auVar137);
            vandps_avx512vl(auVar120,auVar137);
            auVar124 = vmaxps_avx(auVar140,auVar140);
            vandps_avx512vl(auVar125,auVar137);
            auVar124 = vmaxps_avx(auVar124,auVar140);
            uVar88 = vcmpps_avx512vl(auVar124,local_440,1);
            bVar14 = (bool)((byte)uVar88 & 1);
            auVar141._0_4_ = (uint)bVar14 * auVar111._0_4_ | (uint)!bVar14 * auVar123._0_4_;
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar141._4_4_ = (uint)bVar14 * auVar111._4_4_ | (uint)!bVar14 * auVar123._4_4_;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar141._8_4_ = (uint)bVar14 * auVar111._8_4_ | (uint)!bVar14 * auVar123._8_4_;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar141._12_4_ = (uint)bVar14 * auVar111._12_4_ | (uint)!bVar14 * auVar123._12_4_;
            bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar141._16_4_ = (uint)bVar14 * auVar111._16_4_ | (uint)!bVar14 * auVar123._16_4_;
            bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar141._20_4_ = (uint)bVar14 * auVar111._20_4_ | (uint)!bVar14 * auVar123._20_4_;
            bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar141._24_4_ = (uint)bVar14 * auVar111._24_4_ | (uint)!bVar14 * auVar123._24_4_;
            bVar14 = SUB81(uVar88 >> 7,0);
            auVar141._28_4_ = (uint)bVar14 * auVar111._28_4_ | (uint)!bVar14 * auVar123._28_4_;
            bVar14 = (bool)((byte)uVar88 & 1);
            auVar142._0_4_ = (float)((uint)bVar14 * auVar117._0_4_ | (uint)!bVar14 * auVar120._0_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar142._4_4_ = (float)((uint)bVar14 * auVar117._4_4_ | (uint)!bVar14 * auVar120._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar142._8_4_ = (float)((uint)bVar14 * auVar117._8_4_ | (uint)!bVar14 * auVar120._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar142._12_4_ =
                 (float)((uint)bVar14 * auVar117._12_4_ | (uint)!bVar14 * auVar120._12_4_);
            bVar14 = (bool)((byte)(uVar88 >> 4) & 1);
            auVar142._16_4_ =
                 (float)((uint)bVar14 * auVar117._16_4_ | (uint)!bVar14 * auVar120._16_4_);
            bVar14 = (bool)((byte)(uVar88 >> 5) & 1);
            auVar142._20_4_ =
                 (float)((uint)bVar14 * auVar117._20_4_ | (uint)!bVar14 * auVar120._20_4_);
            bVar14 = (bool)((byte)(uVar88 >> 6) & 1);
            auVar142._24_4_ =
                 (float)((uint)bVar14 * auVar117._24_4_ | (uint)!bVar14 * auVar120._24_4_);
            bVar14 = SUB81(uVar88 >> 7,0);
            auVar142._28_4_ = (uint)bVar14 * auVar117._28_4_ | (uint)!bVar14 * auVar120._28_4_;
            auVar210._8_4_ = 0x80000000;
            auVar210._0_8_ = 0x8000000080000000;
            auVar210._12_4_ = 0x80000000;
            auVar210._16_4_ = 0x80000000;
            auVar210._20_4_ = 0x80000000;
            auVar210._24_4_ = 0x80000000;
            auVar210._28_4_ = 0x80000000;
            auVar124 = vxorps_avx512vl(auVar141,auVar210);
            auVar120 = auVar224._0_32_;
            auVar125 = vfmadd213ps_avx512vl(auVar139,auVar139,auVar120);
            auVar99 = vfmadd231ps_fma(auVar125,auVar140,auVar140);
            auVar125 = vrsqrt14ps_avx512vl(ZEXT1632(auVar99));
            auVar218._8_4_ = 0xbf000000;
            auVar218._0_8_ = 0xbf000000bf000000;
            auVar218._12_4_ = 0xbf000000;
            auVar218._16_4_ = 0xbf000000;
            auVar218._20_4_ = 0xbf000000;
            auVar218._24_4_ = 0xbf000000;
            auVar218._28_4_ = 0xbf000000;
            fVar186 = auVar125._0_4_;
            fVar159 = auVar125._4_4_;
            fVar199 = auVar125._8_4_;
            fVar200 = auVar125._12_4_;
            fVar179 = auVar125._16_4_;
            fVar185 = auVar125._20_4_;
            fVar97 = auVar125._24_4_;
            auVar58._4_4_ = fVar159 * fVar159 * fVar159 * auVar99._4_4_ * -0.5;
            auVar58._0_4_ = fVar186 * fVar186 * fVar186 * auVar99._0_4_ * -0.5;
            auVar58._8_4_ = fVar199 * fVar199 * fVar199 * auVar99._8_4_ * -0.5;
            auVar58._12_4_ = fVar200 * fVar200 * fVar200 * auVar99._12_4_ * -0.5;
            auVar58._16_4_ = fVar179 * fVar179 * fVar179 * -0.0;
            auVar58._20_4_ = fVar185 * fVar185 * fVar185 * -0.0;
            auVar58._24_4_ = fVar97 * fVar97 * fVar97 * -0.0;
            auVar58._28_4_ = auVar140._28_4_;
            auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar125 = vfmadd231ps_avx512vl(auVar58,auVar123,auVar125);
            auVar59._4_4_ = auVar140._4_4_ * auVar125._4_4_;
            auVar59._0_4_ = auVar140._0_4_ * auVar125._0_4_;
            auVar59._8_4_ = auVar140._8_4_ * auVar125._8_4_;
            auVar59._12_4_ = auVar140._12_4_ * auVar125._12_4_;
            auVar59._16_4_ = auVar140._16_4_ * auVar125._16_4_;
            auVar59._20_4_ = auVar140._20_4_ * auVar125._20_4_;
            auVar59._24_4_ = auVar140._24_4_ * auVar125._24_4_;
            auVar59._28_4_ = 0;
            auVar60._4_4_ = auVar125._4_4_ * -auVar139._4_4_;
            auVar60._0_4_ = auVar125._0_4_ * -auVar139._0_4_;
            auVar60._8_4_ = auVar125._8_4_ * -auVar139._8_4_;
            auVar60._12_4_ = auVar125._12_4_ * -auVar139._12_4_;
            auVar60._16_4_ = auVar125._16_4_ * -auVar139._16_4_;
            auVar60._20_4_ = auVar125._20_4_ * -auVar139._20_4_;
            auVar60._24_4_ = auVar125._24_4_ * -auVar139._24_4_;
            auVar60._28_4_ = auVar140._28_4_;
            auVar113 = vmulps_avx512vl(auVar125,auVar120);
            auVar125 = vfmadd213ps_avx512vl(auVar141,auVar141,auVar120);
            auVar125 = vfmadd231ps_avx512vl(auVar125,auVar142,auVar142);
            auVar122 = vrsqrt14ps_avx512vl(auVar125);
            auVar125 = vmulps_avx512vl(auVar125,auVar218);
            fVar186 = auVar122._0_4_;
            fVar159 = auVar122._4_4_;
            fVar199 = auVar122._8_4_;
            fVar200 = auVar122._12_4_;
            fVar179 = auVar122._16_4_;
            fVar185 = auVar122._20_4_;
            fVar97 = auVar122._24_4_;
            auVar61._4_4_ = fVar159 * fVar159 * fVar159 * auVar125._4_4_;
            auVar61._0_4_ = fVar186 * fVar186 * fVar186 * auVar125._0_4_;
            auVar61._8_4_ = fVar199 * fVar199 * fVar199 * auVar125._8_4_;
            auVar61._12_4_ = fVar200 * fVar200 * fVar200 * auVar125._12_4_;
            auVar61._16_4_ = fVar179 * fVar179 * fVar179 * auVar125._16_4_;
            auVar61._20_4_ = fVar185 * fVar185 * fVar185 * auVar125._20_4_;
            auVar61._24_4_ = fVar97 * fVar97 * fVar97 * auVar125._24_4_;
            auVar61._28_4_ = auVar125._28_4_;
            auVar125 = vfmadd231ps_avx512vl(auVar61,auVar123,auVar122);
            auVar62._4_4_ = auVar142._4_4_ * auVar125._4_4_;
            auVar62._0_4_ = auVar142._0_4_ * auVar125._0_4_;
            auVar62._8_4_ = auVar142._8_4_ * auVar125._8_4_;
            auVar62._12_4_ = auVar142._12_4_ * auVar125._12_4_;
            auVar62._16_4_ = auVar142._16_4_ * auVar125._16_4_;
            auVar62._20_4_ = auVar142._20_4_ * auVar125._20_4_;
            auVar62._24_4_ = auVar142._24_4_ * auVar125._24_4_;
            auVar62._28_4_ = auVar122._28_4_;
            auVar63._4_4_ = auVar125._4_4_ * auVar124._4_4_;
            auVar63._0_4_ = auVar125._0_4_ * auVar124._0_4_;
            auVar63._8_4_ = auVar125._8_4_ * auVar124._8_4_;
            auVar63._12_4_ = auVar125._12_4_ * auVar124._12_4_;
            auVar63._16_4_ = auVar125._16_4_ * auVar124._16_4_;
            auVar63._20_4_ = auVar125._20_4_ * auVar124._20_4_;
            auVar63._24_4_ = auVar125._24_4_ * auVar124._24_4_;
            auVar63._28_4_ = auVar124._28_4_;
            auVar124 = vmulps_avx512vl(auVar125,auVar120);
            auVar99 = vfmadd213ps_fma(auVar59,ZEXT1632(auVar102),auVar118);
            auVar125 = ZEXT1632(auVar102);
            auVar106 = vfmadd213ps_fma(auVar60,auVar125,auVar109);
            auVar123 = vfmadd213ps_avx512vl(auVar113,auVar125,auVar116);
            auVar122 = vfmadd213ps_avx512vl(auVar62,ZEXT1632(auVar101),auVar110);
            auVar103 = vfnmadd213ps_fma(auVar59,auVar125,auVar118);
            auVar121 = ZEXT1632(auVar101);
            auVar223 = vfmadd213ps_fma(auVar63,auVar121,auVar119);
            auVar104 = vfnmadd213ps_fma(auVar60,auVar125,auVar109);
            auVar6 = vfmadd213ps_fma(auVar124,auVar121,auVar115);
            auVar109 = ZEXT1632(auVar102);
            auVar209 = vfnmadd231ps_fma(auVar116,auVar109,auVar113);
            auVar180 = vfnmadd213ps_fma(auVar62,auVar121,auVar110);
            auVar181 = vfnmadd213ps_fma(auVar63,auVar121,auVar119);
            auVar105 = vfnmadd231ps_fma(auVar115,ZEXT1632(auVar101),auVar124);
            auVar115 = vsubps_avx512vl(auVar122,ZEXT1632(auVar103));
            auVar124 = vsubps_avx(ZEXT1632(auVar223),ZEXT1632(auVar104));
            auVar125 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar209));
            auVar64._4_4_ = auVar124._4_4_ * auVar209._4_4_;
            auVar64._0_4_ = auVar124._0_4_ * auVar209._0_4_;
            auVar64._8_4_ = auVar124._8_4_ * auVar209._8_4_;
            auVar64._12_4_ = auVar124._12_4_ * auVar209._12_4_;
            auVar64._16_4_ = auVar124._16_4_ * 0.0;
            auVar64._20_4_ = auVar124._20_4_ * 0.0;
            auVar64._24_4_ = auVar124._24_4_ * 0.0;
            auVar64._28_4_ = auVar113._28_4_;
            auVar102 = vfmsub231ps_fma(auVar64,ZEXT1632(auVar104),auVar125);
            auVar65._4_4_ = auVar125._4_4_ * auVar103._4_4_;
            auVar65._0_4_ = auVar125._0_4_ * auVar103._0_4_;
            auVar65._8_4_ = auVar125._8_4_ * auVar103._8_4_;
            auVar65._12_4_ = auVar125._12_4_ * auVar103._12_4_;
            auVar65._16_4_ = auVar125._16_4_ * 0.0;
            auVar65._20_4_ = auVar125._20_4_ * 0.0;
            auVar65._24_4_ = auVar125._24_4_ * 0.0;
            auVar65._28_4_ = auVar125._28_4_;
            auVar7 = vfmsub231ps_fma(auVar65,ZEXT1632(auVar209),auVar115);
            auVar66._4_4_ = auVar104._4_4_ * auVar115._4_4_;
            auVar66._0_4_ = auVar104._0_4_ * auVar115._0_4_;
            auVar66._8_4_ = auVar104._8_4_ * auVar115._8_4_;
            auVar66._12_4_ = auVar104._12_4_ * auVar115._12_4_;
            auVar66._16_4_ = auVar115._16_4_ * 0.0;
            auVar66._20_4_ = auVar115._20_4_ * 0.0;
            auVar66._24_4_ = auVar115._24_4_ * 0.0;
            auVar66._28_4_ = auVar115._28_4_;
            auVar100 = vfmsub231ps_fma(auVar66,ZEXT1632(auVar103),auVar124);
            auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar100),auVar120,ZEXT1632(auVar7));
            auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,ZEXT1632(auVar102));
            uVar88 = vcmpps_avx512vl(auVar124,auVar120,2);
            bVar95 = (byte)uVar88;
            fVar151 = (float)((uint)(bVar95 & 1) * auVar99._0_4_ |
                             (uint)!(bool)(bVar95 & 1) * auVar180._0_4_);
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar153 = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar180._4_4_);
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar156 = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar180._8_4_);
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar157 = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar180._12_4_);
            auVar121 = ZEXT1632(CONCAT412(fVar157,CONCAT48(fVar156,CONCAT44(fVar153,fVar151))));
            fVar152 = (float)((uint)(bVar95 & 1) * auVar106._0_4_ |
                             (uint)!(bool)(bVar95 & 1) * auVar181._0_4_);
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            fVar155 = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar181._4_4_);
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            fVar154 = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar181._8_4_);
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            fVar158 = (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar181._12_4_);
            auVar111 = ZEXT1632(CONCAT412(fVar158,CONCAT48(fVar154,CONCAT44(fVar155,fVar152))));
            auVar143._0_4_ =
                 (float)((uint)(bVar95 & 1) * auVar123._0_4_ |
                        (uint)!(bool)(bVar95 & 1) * auVar105._0_4_);
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar143._4_4_ = (float)((uint)bVar14 * auVar123._4_4_ | (uint)!bVar14 * auVar105._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar143._8_4_ = (float)((uint)bVar14 * auVar123._8_4_ | (uint)!bVar14 * auVar105._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar143._12_4_ =
                 (float)((uint)bVar14 * auVar123._12_4_ | (uint)!bVar14 * auVar105._12_4_);
            fVar186 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar123._16_4_);
            auVar143._16_4_ = fVar186;
            fVar159 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar123._20_4_);
            auVar143._20_4_ = fVar159;
            fVar199 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar123._24_4_);
            auVar143._24_4_ = fVar199;
            iVar1 = (uint)(byte)(uVar88 >> 7) * auVar123._28_4_;
            auVar143._28_4_ = iVar1;
            auVar124 = vblendmps_avx512vl(ZEXT1632(auVar103),auVar122);
            auVar144._0_4_ =
                 (uint)(bVar95 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar95 & 1) * auVar102._0_4_;
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar144._4_4_ = (uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * auVar102._4_4_;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar144._8_4_ = (uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * auVar102._8_4_;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar144._12_4_ = (uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * auVar102._12_4_;
            auVar144._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar124._16_4_;
            auVar144._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar124._20_4_;
            auVar144._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar124._24_4_;
            auVar144._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar124._28_4_;
            auVar124 = vblendmps_avx512vl(ZEXT1632(auVar104),ZEXT1632(auVar223));
            auVar145._0_4_ =
                 (float)((uint)(bVar95 & 1) * auVar124._0_4_ |
                        (uint)!(bool)(bVar95 & 1) * auVar99._0_4_);
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar145._4_4_ = (float)((uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * auVar99._4_4_);
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar145._8_4_ = (float)((uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * auVar99._8_4_);
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar145._12_4_ =
                 (float)((uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * auVar99._12_4_);
            fVar179 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar124._16_4_);
            auVar145._16_4_ = fVar179;
            fVar185 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar124._20_4_);
            auVar145._20_4_ = fVar185;
            fVar200 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar124._24_4_);
            auVar145._24_4_ = fVar200;
            auVar145._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar124._28_4_;
            auVar124 = vblendmps_avx512vl(ZEXT1632(auVar209),ZEXT1632(auVar6));
            auVar146._0_4_ =
                 (float)((uint)(bVar95 & 1) * auVar124._0_4_ |
                        (uint)!(bool)(bVar95 & 1) * auVar106._0_4_);
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar146._4_4_ = (float)((uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * auVar106._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar146._8_4_ = (float)((uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * auVar106._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar146._12_4_ =
                 (float)((uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * auVar106._12_4_);
            fVar178 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar124._16_4_);
            auVar146._16_4_ = fVar178;
            fVar97 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar124._20_4_);
            auVar146._20_4_ = fVar97;
            fVar98 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar124._24_4_);
            auVar146._24_4_ = fVar98;
            iVar2 = (uint)(byte)(uVar88 >> 7) * auVar124._28_4_;
            auVar146._28_4_ = iVar2;
            auVar147._0_4_ =
                 (uint)(bVar95 & 1) * (int)auVar103._0_4_ |
                 (uint)!(bool)(bVar95 & 1) * auVar122._0_4_;
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            auVar147._4_4_ = (uint)bVar14 * (int)auVar103._4_4_ | (uint)!bVar14 * auVar122._4_4_;
            bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
            auVar147._8_4_ = (uint)bVar14 * (int)auVar103._8_4_ | (uint)!bVar14 * auVar122._8_4_;
            bVar14 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar147._12_4_ = (uint)bVar14 * (int)auVar103._12_4_ | (uint)!bVar14 * auVar122._12_4_;
            auVar147._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar122._16_4_;
            auVar147._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar122._20_4_;
            auVar147._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar122._24_4_;
            auVar147._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar122._28_4_;
            bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar88 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar88 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar88 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar88 >> 3) & 1);
            auVar122 = vsubps_avx512vl(auVar147,auVar121);
            auVar125 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar104._12_4_ |
                                                     (uint)!bVar18 * auVar223._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar104._8_4_ |
                                                              (uint)!bVar16 * auVar223._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar104._4_4_ |
                                                                       (uint)!bVar14 *
                                                                       auVar223._4_4_,
                                                                       (uint)(bVar95 & 1) *
                                                                       (int)auVar104._0_4_ |
                                                                       (uint)!(bool)(bVar95 & 1) *
                                                                       auVar223._0_4_)))),auVar111);
            auVar123 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar209._12_4_ |
                                                     (uint)!bVar19 * auVar6._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar209._8_4_ |
                                                              (uint)!bVar17 * auVar6._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar209._4_4_ |
                                                                       (uint)!bVar15 * auVar6._4_4_,
                                                                       (uint)(bVar95 & 1) *
                                                                       (int)auVar209._0_4_ |
                                                                       (uint)!(bool)(bVar95 & 1) *
                                                                       auVar6._0_4_)))),auVar143);
            auVar113 = vsubps_avx(auVar121,auVar144);
            auVar115 = vsubps_avx(auVar111,auVar145);
            auVar116 = vsubps_avx(auVar143,auVar146);
            auVar67._4_4_ = auVar123._4_4_ * fVar153;
            auVar67._0_4_ = auVar123._0_4_ * fVar151;
            auVar67._8_4_ = auVar123._8_4_ * fVar156;
            auVar67._12_4_ = auVar123._12_4_ * fVar157;
            auVar67._16_4_ = auVar123._16_4_ * 0.0;
            auVar67._20_4_ = auVar123._20_4_ * 0.0;
            auVar67._24_4_ = auVar123._24_4_ * 0.0;
            auVar67._28_4_ = 0;
            auVar102 = vfmsub231ps_fma(auVar67,auVar143,auVar122);
            auVar183._0_4_ = fVar152 * auVar122._0_4_;
            auVar183._4_4_ = fVar155 * auVar122._4_4_;
            auVar183._8_4_ = fVar154 * auVar122._8_4_;
            auVar183._12_4_ = fVar158 * auVar122._12_4_;
            auVar183._16_4_ = auVar122._16_4_ * 0.0;
            auVar183._20_4_ = auVar122._20_4_ * 0.0;
            auVar183._24_4_ = auVar122._24_4_ * 0.0;
            auVar183._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar183,auVar121,auVar125);
            auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar120,ZEXT1632(auVar102));
            auVar197._0_4_ = auVar125._0_4_ * auVar143._0_4_;
            auVar197._4_4_ = auVar125._4_4_ * auVar143._4_4_;
            auVar197._8_4_ = auVar125._8_4_ * auVar143._8_4_;
            auVar197._12_4_ = auVar125._12_4_ * auVar143._12_4_;
            auVar197._16_4_ = auVar125._16_4_ * fVar186;
            auVar197._20_4_ = auVar125._20_4_ * fVar159;
            auVar197._24_4_ = auVar125._24_4_ * fVar199;
            auVar197._28_4_ = 0;
            auVar102 = vfmsub231ps_fma(auVar197,auVar111,auVar123);
            auVar117 = vfmadd231ps_avx512vl(auVar124,auVar120,ZEXT1632(auVar102));
            auVar124 = vmulps_avx512vl(auVar116,auVar144);
            auVar124 = vfmsub231ps_avx512vl(auVar124,auVar113,auVar146);
            auVar68._4_4_ = auVar115._4_4_ * auVar146._4_4_;
            auVar68._0_4_ = auVar115._0_4_ * auVar146._0_4_;
            auVar68._8_4_ = auVar115._8_4_ * auVar146._8_4_;
            auVar68._12_4_ = auVar115._12_4_ * auVar146._12_4_;
            auVar68._16_4_ = auVar115._16_4_ * fVar178;
            auVar68._20_4_ = auVar115._20_4_ * fVar97;
            auVar68._24_4_ = auVar115._24_4_ * fVar98;
            auVar68._28_4_ = iVar2;
            auVar102 = vfmsub231ps_fma(auVar68,auVar145,auVar116);
            auVar198._0_4_ = auVar145._0_4_ * auVar113._0_4_;
            auVar198._4_4_ = auVar145._4_4_ * auVar113._4_4_;
            auVar198._8_4_ = auVar145._8_4_ * auVar113._8_4_;
            auVar198._12_4_ = auVar145._12_4_ * auVar113._12_4_;
            auVar198._16_4_ = fVar179 * auVar113._16_4_;
            auVar198._20_4_ = fVar185 * auVar113._20_4_;
            auVar198._24_4_ = fVar200 * auVar113._24_4_;
            auVar198._28_4_ = 0;
            auVar99 = vfmsub231ps_fma(auVar198,auVar115,auVar144);
            auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar99),auVar120,auVar124);
            auVar118 = vfmadd231ps_avx512vl(auVar124,auVar120,ZEXT1632(auVar102));
            auVar124 = vmaxps_avx(auVar117,auVar118);
            uVar161 = vcmpps_avx512vl(auVar124,auVar120,2);
            local_350 = local_350 & (byte)uVar161;
            auVar221 = ZEXT3264(auVar204);
            if (local_350 == 0) {
LAB_01d52b8f:
              local_350 = 0;
            }
            else {
              auVar69._4_4_ = auVar116._4_4_ * auVar125._4_4_;
              auVar69._0_4_ = auVar116._0_4_ * auVar125._0_4_;
              auVar69._8_4_ = auVar116._8_4_ * auVar125._8_4_;
              auVar69._12_4_ = auVar116._12_4_ * auVar125._12_4_;
              auVar69._16_4_ = auVar116._16_4_ * auVar125._16_4_;
              auVar69._20_4_ = auVar116._20_4_ * auVar125._20_4_;
              auVar69._24_4_ = auVar116._24_4_ * auVar125._24_4_;
              auVar69._28_4_ = auVar124._28_4_;
              auVar106 = vfmsub231ps_fma(auVar69,auVar115,auVar123);
              auVar70._4_4_ = auVar123._4_4_ * auVar113._4_4_;
              auVar70._0_4_ = auVar123._0_4_ * auVar113._0_4_;
              auVar70._8_4_ = auVar123._8_4_ * auVar113._8_4_;
              auVar70._12_4_ = auVar123._12_4_ * auVar113._12_4_;
              auVar70._16_4_ = auVar123._16_4_ * auVar113._16_4_;
              auVar70._20_4_ = auVar123._20_4_ * auVar113._20_4_;
              auVar70._24_4_ = auVar123._24_4_ * auVar113._24_4_;
              auVar70._28_4_ = auVar123._28_4_;
              auVar99 = vfmsub231ps_fma(auVar70,auVar122,auVar116);
              auVar71._4_4_ = auVar115._4_4_ * auVar122._4_4_;
              auVar71._0_4_ = auVar115._0_4_ * auVar122._0_4_;
              auVar71._8_4_ = auVar115._8_4_ * auVar122._8_4_;
              auVar71._12_4_ = auVar115._12_4_ * auVar122._12_4_;
              auVar71._16_4_ = auVar115._16_4_ * auVar122._16_4_;
              auVar71._20_4_ = auVar115._20_4_ * auVar122._20_4_;
              auVar71._24_4_ = auVar115._24_4_ * auVar122._24_4_;
              auVar71._28_4_ = auVar115._28_4_;
              auVar223 = vfmsub231ps_fma(auVar71,auVar113,auVar125);
              auVar102 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar99),ZEXT1632(auVar223));
              auVar124 = vfmadd231ps_avx512vl(ZEXT1632(auVar102),ZEXT1632(auVar106),auVar120);
              auVar125 = vrcp14ps_avx512vl(auVar124);
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = &DAT_3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar33._16_4_ = 0x3f800000;
              auVar33._20_4_ = 0x3f800000;
              auVar33._24_4_ = 0x3f800000;
              auVar33._28_4_ = 0x3f800000;
              auVar123 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar33);
              auVar102 = vfmadd132ps_fma(auVar123,auVar125,auVar125);
              auVar72._4_4_ = auVar223._4_4_ * auVar143._4_4_;
              auVar72._0_4_ = auVar223._0_4_ * auVar143._0_4_;
              auVar72._8_4_ = auVar223._8_4_ * auVar143._8_4_;
              auVar72._12_4_ = auVar223._12_4_ * auVar143._12_4_;
              auVar72._16_4_ = fVar186 * 0.0;
              auVar72._20_4_ = fVar159 * 0.0;
              auVar72._24_4_ = fVar199 * 0.0;
              auVar72._28_4_ = iVar1;
              auVar99 = vfmadd231ps_fma(auVar72,auVar111,ZEXT1632(auVar99));
              auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar121,ZEXT1632(auVar106));
              fVar186 = auVar102._0_4_;
              fVar159 = auVar102._4_4_;
              fVar199 = auVar102._8_4_;
              fVar200 = auVar102._12_4_;
              auVar125 = ZEXT1632(CONCAT412(auVar99._12_4_ * fVar200,
                                            CONCAT48(auVar99._8_4_ * fVar199,
                                                     CONCAT44(auVar99._4_4_ * fVar159,
                                                              auVar99._0_4_ * fVar186))));
              auVar85._4_4_ = uStack_4bc;
              auVar85._0_4_ = local_4c0;
              auVar85._8_4_ = uStack_4b8;
              auVar85._12_4_ = uStack_4b4;
              auVar85._16_4_ = uStack_4b0;
              auVar85._20_4_ = uStack_4ac;
              auVar85._24_4_ = uStack_4a8;
              auVar85._28_4_ = uStack_4a4;
              uVar161 = vcmpps_avx512vl(auVar125,auVar85,0xd);
              uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar34._4_4_ = uVar160;
              auVar34._0_4_ = uVar160;
              auVar34._8_4_ = uVar160;
              auVar34._12_4_ = uVar160;
              auVar34._16_4_ = uVar160;
              auVar34._20_4_ = uVar160;
              auVar34._24_4_ = uVar160;
              auVar34._28_4_ = uVar160;
              uVar22 = vcmpps_avx512vl(auVar125,auVar34,2);
              local_350 = (byte)uVar161 & (byte)uVar22 & local_350;
              if (local_350 == 0) goto LAB_01d52b8f;
              uVar161 = vcmpps_avx512vl(auVar124,auVar120,4);
              if ((local_350 & (byte)uVar161) == 0) {
                local_350 = 0;
              }
              else {
                local_350 = local_350 & (byte)uVar161;
                fVar179 = auVar117._0_4_ * fVar186;
                fVar185 = auVar117._4_4_ * fVar159;
                auVar73._4_4_ = fVar185;
                auVar73._0_4_ = fVar179;
                fVar97 = auVar117._8_4_ * fVar199;
                auVar73._8_4_ = fVar97;
                fVar98 = auVar117._12_4_ * fVar200;
                auVar73._12_4_ = fVar98;
                fVar178 = auVar117._16_4_ * 0.0;
                auVar73._16_4_ = fVar178;
                fVar151 = auVar117._20_4_ * 0.0;
                auVar73._20_4_ = fVar151;
                fVar152 = auVar117._24_4_ * 0.0;
                auVar73._24_4_ = fVar152;
                auVar73._28_4_ = auVar117._28_4_;
                fVar186 = auVar118._0_4_ * fVar186;
                fVar159 = auVar118._4_4_ * fVar159;
                auVar74._4_4_ = fVar159;
                auVar74._0_4_ = fVar186;
                fVar199 = auVar118._8_4_ * fVar199;
                auVar74._8_4_ = fVar199;
                fVar200 = auVar118._12_4_ * fVar200;
                auVar74._12_4_ = fVar200;
                fVar153 = auVar118._16_4_ * 0.0;
                auVar74._16_4_ = fVar153;
                fVar155 = auVar118._20_4_ * 0.0;
                auVar74._20_4_ = fVar155;
                fVar156 = auVar118._24_4_ * 0.0;
                auVar74._24_4_ = fVar156;
                auVar74._28_4_ = auVar118._28_4_;
                auVar202._8_4_ = 0x3f800000;
                auVar202._0_8_ = &DAT_3f8000003f800000;
                auVar202._12_4_ = 0x3f800000;
                auVar202._16_4_ = 0x3f800000;
                auVar202._20_4_ = 0x3f800000;
                auVar202._24_4_ = 0x3f800000;
                auVar202._28_4_ = 0x3f800000;
                auVar124 = vsubps_avx512vl(auVar202,auVar73);
                bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar88 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar88 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar88 >> 6) & 1);
                bVar20 = SUB81(uVar88 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar20 * auVar117._28_4_ |
                                              (uint)!bVar20 * auVar124._28_4_,
                                              CONCAT424((uint)bVar19 * (int)fVar152 |
                                                        (uint)!bVar19 * auVar124._24_4_,
                                                        CONCAT420((uint)bVar18 * (int)fVar151 |
                                                                  (uint)!bVar18 * auVar124._20_4_,
                                                                  CONCAT416((uint)bVar17 *
                                                                            (int)fVar178 |
                                                                            (uint)!bVar17 *
                                                                            auVar124._16_4_,
                                                                            CONCAT412((uint)bVar16 *
                                                                                      (int)fVar98 |
                                                                                      (uint)!bVar16
                                                                                      * auVar124.
                                                  _12_4_,CONCAT48((uint)bVar15 * (int)fVar97 |
                                                                  (uint)!bVar15 * auVar124._8_4_,
                                                                  CONCAT44((uint)bVar14 *
                                                                           (int)fVar185 |
                                                                           (uint)!bVar14 *
                                                                           auVar124._4_4_,
                                                                           (uint)(bVar95 & 1) *
                                                                           (int)fVar179 |
                                                                           (uint)!(bool)(bVar95 & 1)
                                                                           * auVar124._0_4_))))))));
                auVar124 = vsubps_avx(auVar202,auVar74);
                bVar14 = (bool)((byte)(uVar88 >> 1) & 1);
                bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
                bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
                bVar17 = (bool)((byte)(uVar88 >> 4) & 1);
                bVar18 = (bool)((byte)(uVar88 >> 5) & 1);
                bVar19 = (bool)((byte)(uVar88 >> 6) & 1);
                bVar20 = SUB81(uVar88 >> 7,0);
                local_240._4_4_ = (uint)bVar14 * (int)fVar159 | (uint)!bVar14 * auVar124._4_4_;
                local_240._0_4_ =
                     (uint)(bVar95 & 1) * (int)fVar186 | (uint)!(bool)(bVar95 & 1) * auVar124._0_4_;
                local_240._8_4_ = (uint)bVar15 * (int)fVar199 | (uint)!bVar15 * auVar124._8_4_;
                local_240._12_4_ = (uint)bVar16 * (int)fVar200 | (uint)!bVar16 * auVar124._12_4_;
                local_240._16_4_ = (uint)bVar17 * (int)fVar153 | (uint)!bVar17 * auVar124._16_4_;
                local_240._20_4_ = (uint)bVar18 * (int)fVar155 | (uint)!bVar18 * auVar124._20_4_;
                local_240._24_4_ = (uint)bVar19 * (int)fVar156 | (uint)!bVar19 * auVar124._24_4_;
                local_240._28_4_ = (uint)bVar20 * auVar118._28_4_ | (uint)!bVar20 * auVar124._28_4_;
                in_ZMM21 = ZEXT3264(auVar125);
              }
            }
            auVar219 = ZEXT3264(local_620);
            if (local_350 != 0) {
              auVar124 = vsubps_avx(ZEXT1632(auVar101),auVar109);
              local_560 = in_ZMM20._0_32_;
              auVar124 = vfmadd213ps_avx512vl(auVar124,local_560,auVar109);
              auVar168._0_4_ = auVar124._0_4_ + auVar124._0_4_;
              auVar168._4_4_ = auVar124._4_4_ + auVar124._4_4_;
              auVar168._8_4_ = auVar124._8_4_ + auVar124._8_4_;
              auVar168._12_4_ = auVar124._12_4_ + auVar124._12_4_;
              auVar168._16_4_ = auVar124._16_4_ + auVar124._16_4_;
              auVar168._20_4_ = auVar124._20_4_ + auVar124._20_4_;
              auVar168._24_4_ = auVar124._24_4_ + auVar124._24_4_;
              auVar168._28_4_ = auVar124._28_4_ + auVar124._28_4_;
              uVar160 = *(undefined4 *)((long)local_660->ray_space + k * 4 + -0x10);
              auVar35._4_4_ = uVar160;
              auVar35._0_4_ = uVar160;
              auVar35._8_4_ = uVar160;
              auVar35._12_4_ = uVar160;
              auVar35._16_4_ = uVar160;
              auVar35._20_4_ = uVar160;
              auVar35._24_4_ = uVar160;
              auVar35._28_4_ = uVar160;
              auVar124 = vmulps_avx512vl(auVar168,auVar35);
              local_580 = in_ZMM21._0_32_;
              uVar161 = vcmpps_avx512vl(local_580,auVar124,6);
              local_350 = local_350 & (byte)uVar161;
              if (local_350 != 0) {
                auVar169._8_4_ = 0xbf800000;
                auVar169._0_8_ = 0xbf800000bf800000;
                auVar169._12_4_ = 0xbf800000;
                auVar169._16_4_ = 0xbf800000;
                auVar169._20_4_ = 0xbf800000;
                auVar169._24_4_ = 0xbf800000;
                auVar169._28_4_ = 0xbf800000;
                auVar36._8_4_ = 0x40000000;
                auVar36._0_8_ = 0x4000000040000000;
                auVar36._12_4_ = 0x40000000;
                auVar36._16_4_ = 0x40000000;
                auVar36._20_4_ = 0x40000000;
                auVar36._24_4_ = 0x40000000;
                auVar36._28_4_ = 0x40000000;
                local_3e0 = vfmadd132ps_avx512vl(local_240,auVar169,auVar36);
                local_240 = local_3e0;
                auVar124 = local_240;
                local_3a0 = (undefined4)lVar92;
                local_380 = local_5d0._0_8_;
                uStack_378 = local_5d0._8_8_;
                local_370 = local_5e0._0_8_;
                uStack_368 = local_5e0._8_8_;
                local_360 = local_5f0;
                uStack_358 = uStack_5e8;
                pGVar11 = (context->scene->geometries).items[uVar93].ptr;
                local_240 = auVar124;
                if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  auVar124 = vaddps_avx512vl(local_560,_DAT_02020f40);
                  auVar102 = vcvtsi2ss_avx512f(auVar220._0_16_,local_3a0);
                  fVar186 = auVar102._0_4_;
                  local_340[0] = (fVar186 + auVar124._0_4_) * (float)local_4e0._0_4_;
                  local_340[1] = (fVar186 + auVar124._4_4_) * (float)local_4e0._4_4_;
                  local_340[2] = (fVar186 + auVar124._8_4_) * fStack_4d8;
                  local_340[3] = (fVar186 + auVar124._12_4_) * fStack_4d4;
                  fStack_330 = (fVar186 + auVar124._16_4_) * fStack_4d0;
                  fStack_32c = (fVar186 + auVar124._20_4_) * fStack_4cc;
                  fStack_328 = (fVar186 + auVar124._24_4_) * fStack_4c8;
                  fStack_324 = fVar186 + auVar124._28_4_;
                  local_240._0_8_ = local_3e0._0_8_;
                  local_240._8_8_ = local_3e0._8_8_;
                  local_240._16_8_ = local_3e0._16_8_;
                  local_240._24_8_ = local_3e0._24_8_;
                  local_320 = local_240._0_8_;
                  uStack_318 = local_240._8_8_;
                  uStack_310 = local_240._16_8_;
                  uStack_308 = local_240._24_8_;
                  local_300 = local_580;
                  auVar170._8_4_ = 0x7f800000;
                  auVar170._0_8_ = 0x7f8000007f800000;
                  auVar170._12_4_ = 0x7f800000;
                  auVar170._16_4_ = 0x7f800000;
                  auVar170._20_4_ = 0x7f800000;
                  auVar170._24_4_ = 0x7f800000;
                  auVar170._28_4_ = 0x7f800000;
                  auVar124 = vblendmps_avx512vl(auVar170,local_580);
                  auVar148._0_4_ =
                       (uint)(local_350 & 1) * auVar124._0_4_ |
                       (uint)!(bool)(local_350 & 1) * 0x7f800000;
                  bVar14 = (bool)(local_350 >> 1 & 1);
                  auVar148._4_4_ = (uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_350 >> 2 & 1);
                  auVar148._8_4_ = (uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_350 >> 3 & 1);
                  auVar148._12_4_ = (uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_350 >> 4 & 1);
                  auVar148._16_4_ = (uint)bVar14 * auVar124._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_350 >> 5 & 1);
                  auVar148._20_4_ = (uint)bVar14 * auVar124._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)(local_350 >> 6 & 1);
                  auVar148._24_4_ = (uint)bVar14 * auVar124._24_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar148._28_4_ =
                       (uint)(local_350 >> 7) * auVar124._28_4_ |
                       (uint)!(bool)(local_350 >> 7) * 0x7f800000;
                  auVar124 = vshufps_avx(auVar148,auVar148,0xb1);
                  auVar124 = vminps_avx(auVar148,auVar124);
                  auVar125 = vshufpd_avx(auVar124,auVar124,5);
                  auVar124 = vminps_avx(auVar124,auVar125);
                  auVar125 = vpermpd_avx2(auVar124,0x4e);
                  auVar124 = vminps_avx(auVar124,auVar125);
                  uVar161 = vcmpps_avx512vl(auVar148,auVar124,0);
                  bVar87 = (byte)uVar161 & local_350;
                  bVar95 = local_350;
                  if (bVar87 != 0) {
                    bVar95 = bVar87;
                  }
                  uVar208 = 0;
                  for (uVar90 = (uint)bVar95; (uVar90 & 1) == 0; uVar90 = uVar90 >> 1 | 0x80000000)
                  {
                    uVar208 = uVar208 + 1;
                  }
                  uVar88 = (ulong)uVar208;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar186 = local_340[uVar88];
                    uVar160 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                    fVar159 = 1.0 - fVar186;
                    auVar25._8_4_ = 0x80000000;
                    auVar25._0_8_ = 0x8000000080000000;
                    auVar25._12_4_ = 0x80000000;
                    auVar99 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar25);
                    auVar102 = ZEXT416((uint)(fVar186 * fVar159 * 4.0));
                    auVar101 = vfnmsub213ss_fma(ZEXT416((uint)fVar186),ZEXT416((uint)fVar186),
                                                auVar102);
                    auVar102 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),
                                               auVar102);
                    fVar159 = fVar159 * auVar99._0_4_ * 0.5;
                    fVar199 = auVar101._0_4_ * 0.5;
                    fVar200 = auVar102._0_4_ * 0.5;
                    fVar179 = fVar186 * fVar186 * 0.5;
                    auVar189._0_4_ = fVar179 * (float)local_5f0._0_4_;
                    auVar189._4_4_ = fVar179 * (float)local_5f0._4_4_;
                    auVar189._8_4_ = fVar179 * (float)uStack_5e8;
                    auVar189._12_4_ = fVar179 * uStack_5e8._4_4_;
                    auVar176._4_4_ = fVar200;
                    auVar176._0_4_ = fVar200;
                    auVar176._8_4_ = fVar200;
                    auVar176._12_4_ = fVar200;
                    auVar102 = vfmadd132ps_fma(auVar176,auVar189,local_5e0);
                    auVar190._4_4_ = fVar199;
                    auVar190._0_4_ = fVar199;
                    auVar190._8_4_ = fVar199;
                    auVar190._12_4_ = fVar199;
                    auVar102 = vfmadd132ps_fma(auVar190,auVar102,local_5d0);
                    auVar177._4_4_ = fVar159;
                    auVar177._0_4_ = fVar159;
                    auVar177._8_4_ = fVar159;
                    auVar177._12_4_ = fVar159;
                    auVar102 = vfmadd213ps_fma(auVar177,auVar21,auVar102);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar102._0_4_;
                    uVar10 = vextractps_avx(auVar102,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar10;
                    uVar10 = vextractps_avx(auVar102,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar10;
                    *(float *)(ray + k * 4 + 0xf0) = fVar186;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar160;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar3;
                    *(uint *)(ray + k * 4 + 0x120) = uVar93;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                  else {
                    local_520 = local_5d0._0_8_;
                    uStack_518 = local_5d0._8_8_;
                    local_530 = local_5e0._0_4_;
                    fStack_52c = local_5e0._4_4_;
                    fStack_528 = local_5e0._8_4_;
                    fStack_524 = local_5e0._12_4_;
                    local_1d0 = local_5f0;
                    uStack_1c8 = uStack_5e8;
                    local_628 = lVar92;
                    local_400 = local_560;
                    local_3c0 = local_580;
                    local_39c = iVar9;
                    local_390 = auVar21;
                    bVar95 = local_350;
                    do {
                      auVar102 = local_500;
                      local_500._1_3_ = 0;
                      local_500[0] = bVar95;
                      auVar106 = auVar224._0_16_;
                      local_500._4_12_ = auVar102._4_12_;
                      local_510 = *(undefined4 *)(ray + k * 4 + 0x80);
                      fVar186 = local_340[uVar88];
                      local_2a0._4_4_ = fVar186;
                      local_2a0._0_4_ = fVar186;
                      local_2a0._8_4_ = fVar186;
                      local_2a0._12_4_ = fVar186;
                      local_290 = *(undefined4 *)((long)&local_320 + uVar88 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_300 + uVar88 * 4);
                      local_658.context = context->user;
                      fVar159 = 1.0 - fVar186;
                      auVar26._8_4_ = 0x80000000;
                      auVar26._0_8_ = 0x8000000080000000;
                      auVar26._12_4_ = 0x80000000;
                      auVar99 = vxorps_avx512vl(ZEXT416((uint)fVar159),auVar26);
                      auVar102 = ZEXT416((uint)(fVar186 * fVar159 * 4.0));
                      auVar101 = vfnmsub213ss_fma(local_2a0,local_2a0,auVar102);
                      auVar102 = vfmadd213ss_fma(ZEXT416((uint)fVar159),ZEXT416((uint)fVar159),
                                                 auVar102);
                      fVar159 = fVar159 * auVar99._0_4_ * 0.5;
                      fVar199 = auVar101._0_4_ * 0.5;
                      fVar200 = auVar102._0_4_ * 0.5;
                      fVar186 = fVar186 * fVar186 * 0.5;
                      auVar191._0_4_ = fVar186 * (float)local_1d0;
                      auVar191._4_4_ = fVar186 * local_1d0._4_4_;
                      auVar191._8_4_ = fVar186 * (float)uStack_1c8;
                      auVar191._12_4_ = fVar186 * uStack_1c8._4_4_;
                      auVar162._4_4_ = fVar200;
                      auVar162._0_4_ = fVar200;
                      auVar162._8_4_ = fVar200;
                      auVar162._12_4_ = fVar200;
                      auVar81._4_4_ = fStack_52c;
                      auVar81._0_4_ = local_530;
                      auVar81._8_4_ = fStack_528;
                      auVar81._12_4_ = fStack_524;
                      auVar102 = vfmadd132ps_fma(auVar162,auVar191,auVar81);
                      auVar192._4_4_ = fVar199;
                      auVar192._0_4_ = fVar199;
                      auVar192._8_4_ = fVar199;
                      auVar192._12_4_ = fVar199;
                      auVar82._8_8_ = uStack_518;
                      auVar82._0_8_ = local_520;
                      auVar102 = vfmadd132ps_fma(auVar192,auVar102,auVar82);
                      auVar163._4_4_ = fVar159;
                      auVar163._0_4_ = fVar159;
                      auVar163._8_4_ = fVar159;
                      auVar163._12_4_ = fVar159;
                      auVar102 = vfmadd213ps_fma(auVar163,auVar21,auVar102);
                      local_2d0 = auVar102._0_4_;
                      local_2c0 = vshufps_avx(auVar102,auVar102,0x55);
                      local_2b0 = vshufps_avx(auVar102,auVar102,0xaa);
                      iStack_2cc = local_2d0;
                      iStack_2c8 = local_2d0;
                      iStack_2c4 = local_2d0;
                      uStack_28c = local_290;
                      uStack_288 = local_290;
                      uStack_284 = local_290;
                      local_280 = local_4f0._0_8_;
                      uStack_278 = local_4f0._8_8_;
                      local_270 = local_600;
                      vpcmpeqd_avx2(ZEXT1632(local_600),ZEXT1632(local_600));
                      uStack_25c = (local_658.context)->instID[0];
                      local_260 = uStack_25c;
                      uStack_258 = uStack_25c;
                      uStack_254 = uStack_25c;
                      uStack_250 = (local_658.context)->instPrimID[0];
                      uStack_24c = uStack_250;
                      uStack_248 = uStack_250;
                      uStack_244 = uStack_250;
                      local_670 = local_410._0_8_;
                      uStack_668 = local_410._8_8_;
                      local_658.valid = (int *)&local_670;
                      local_658.geometryUserPtr = pGVar11->userPtr;
                      local_658.hit = (RTCHitN *)&local_2d0;
                      local_658.N = 4;
                      local_658.ray = (RTCRayN *)ray;
                      if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar11->intersectionFilterN)(&local_658);
                        auVar226 = ZEXT3264(local_5c0);
                        auVar225 = ZEXT3264(local_5a0);
                        auVar219 = ZEXT3264(local_620);
                        auVar221 = ZEXT3264(local_480);
                        auVar222 = ZEXT3264(local_460);
                        in_ZMM21 = ZEXT3264(local_580);
                        in_ZMM20 = ZEXT3264(local_560);
                        auVar102 = vxorps_avx512vl(auVar106,auVar106);
                        auVar224 = ZEXT1664(auVar102);
                        lVar92 = local_628;
                      }
                      auVar102 = auVar224._0_16_;
                      auVar77._8_8_ = uStack_668;
                      auVar77._0_8_ = local_670;
                      uVar96 = vptestmd_avx512vl(auVar77,auVar77);
                      if ((uVar96 & 0xf) == 0) {
LAB_01d52fb1:
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_510;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_658);
                          auVar226 = ZEXT3264(local_5c0);
                          auVar225 = ZEXT3264(local_5a0);
                          auVar219 = ZEXT3264(local_620);
                          auVar221 = ZEXT3264(local_480);
                          auVar222 = ZEXT3264(local_460);
                          in_ZMM21 = ZEXT3264(local_580);
                          in_ZMM20 = ZEXT3264(local_560);
                          auVar102 = vxorps_avx512vl(auVar102,auVar102);
                          auVar224 = ZEXT1664(auVar102);
                          lVar92 = local_628;
                        }
                        auVar78._8_8_ = uStack_668;
                        auVar78._0_8_ = local_670;
                        uVar96 = vptestmd_avx512vl(auVar78,auVar78);
                        uVar96 = uVar96 & 0xf;
                        bVar95 = (byte)uVar96;
                        if (bVar95 == 0) goto LAB_01d52fb1;
                        iVar1 = *(int *)(local_658.hit + 4);
                        iVar2 = *(int *)(local_658.hit + 8);
                        iVar76 = *(int *)(local_658.hit + 0xc);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = SUB81(uVar96 >> 3,0);
                        *(uint *)(local_658.ray + 0xc0) =
                             (uint)(bVar95 & 1) * *(int *)local_658.hit |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_658.ray + 0xc0);
                        *(uint *)(local_658.ray + 0xc4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xc4);
                        *(uint *)(local_658.ray + 200) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 200);
                        *(uint *)(local_658.ray + 0xcc) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xcc);
                        iVar1 = *(int *)(local_658.hit + 0x14);
                        iVar2 = *(int *)(local_658.hit + 0x18);
                        iVar76 = *(int *)(local_658.hit + 0x1c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = SUB81(uVar96 >> 3,0);
                        *(uint *)(local_658.ray + 0xd0) =
                             (uint)(bVar95 & 1) * *(int *)(local_658.hit + 0x10) |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_658.ray + 0xd0);
                        *(uint *)(local_658.ray + 0xd4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xd4);
                        *(uint *)(local_658.ray + 0xd8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 0xd8);
                        *(uint *)(local_658.ray + 0xdc) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xdc);
                        iVar1 = *(int *)(local_658.hit + 0x24);
                        iVar2 = *(int *)(local_658.hit + 0x28);
                        iVar76 = *(int *)(local_658.hit + 0x2c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = SUB81(uVar96 >> 3,0);
                        *(uint *)(local_658.ray + 0xe0) =
                             (uint)(bVar95 & 1) * *(int *)(local_658.hit + 0x20) |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_658.ray + 0xe0);
                        *(uint *)(local_658.ray + 0xe4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xe4);
                        *(uint *)(local_658.ray + 0xe8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 0xe8);
                        *(uint *)(local_658.ray + 0xec) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xec);
                        iVar1 = *(int *)(local_658.hit + 0x34);
                        iVar2 = *(int *)(local_658.hit + 0x38);
                        iVar76 = *(int *)(local_658.hit + 0x3c);
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar96 >> 2) & 1);
                        bVar16 = SUB81(uVar96 >> 3,0);
                        *(uint *)(local_658.ray + 0xf0) =
                             (uint)(bVar95 & 1) * *(int *)(local_658.hit + 0x30) |
                             (uint)!(bool)(bVar95 & 1) * *(int *)(local_658.ray + 0xf0);
                        *(uint *)(local_658.ray + 0xf4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_658.ray + 0xf4);
                        *(uint *)(local_658.ray + 0xf8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_658.ray + 0xf8);
                        *(uint *)(local_658.ray + 0xfc) =
                             (uint)bVar16 * iVar76 | (uint)!bVar16 * *(int *)(local_658.ray + 0xfc);
                        auVar102 = *(undefined1 (*) [16])(local_658.ray + 0x100);
                        auVar107._0_4_ =
                             (uint)(bVar95 & 1) * *(int *)(local_658.hit + 0x40) |
                             (uint)!(bool)(bVar95 & 1) * auVar102._0_4_;
                        bVar14 = (bool)((byte)(uVar96 >> 1) & 1);
                        auVar107._4_4_ =
                             (uint)bVar14 * *(int *)(local_658.hit + 0x44) |
                             (uint)!bVar14 * auVar102._4_4_;
                        bVar14 = (bool)((byte)(uVar96 >> 2) & 1);
                        auVar107._8_4_ =
                             (uint)bVar14 * *(int *)(local_658.hit + 0x48) |
                             (uint)!bVar14 * auVar102._8_4_;
                        bVar14 = SUB81(uVar96 >> 3,0);
                        auVar107._12_4_ =
                             (uint)bVar14 * *(int *)(local_658.hit + 0x4c) |
                             (uint)!bVar14 * auVar102._12_4_;
                        *(undefined1 (*) [16])(local_658.ray + 0x100) = auVar107;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x50));
                        *(undefined1 (*) [16])(local_658.ray + 0x110) = auVar102;
                        auVar102 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x60));
                        *(undefined1 (*) [16])(local_658.ray + 0x120) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x70));
                        *(undefined1 (*) [16])(local_658.ray + 0x130) = auVar102;
                        auVar102 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_658.hit + 0x80));
                        *(undefined1 (*) [16])(local_658.ray + 0x140) = auVar102;
                      }
                      bVar87 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & local_500[0];
                      uVar160 = *(undefined4 *)(ray + k * 4 + 0x80);
                      auVar37._4_4_ = uVar160;
                      auVar37._0_4_ = uVar160;
                      auVar37._8_4_ = uVar160;
                      auVar37._12_4_ = uVar160;
                      auVar37._16_4_ = uVar160;
                      auVar37._20_4_ = uVar160;
                      auVar37._24_4_ = uVar160;
                      auVar37._28_4_ = uVar160;
                      uVar161 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar37,2);
                      bVar95 = bVar87 & (byte)uVar161;
                      if ((bVar87 & (byte)uVar161) != 0) {
                        auVar171._8_4_ = 0x7f800000;
                        auVar171._0_8_ = 0x7f8000007f800000;
                        auVar171._12_4_ = 0x7f800000;
                        auVar171._16_4_ = 0x7f800000;
                        auVar171._20_4_ = 0x7f800000;
                        auVar171._24_4_ = 0x7f800000;
                        auVar171._28_4_ = 0x7f800000;
                        auVar124 = vblendmps_avx512vl(auVar171,in_ZMM21._0_32_);
                        auVar149._0_4_ =
                             (uint)(bVar95 & 1) * auVar124._0_4_ |
                             (uint)!(bool)(bVar95 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar95 >> 1 & 1);
                        auVar149._4_4_ = (uint)bVar14 * auVar124._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar95 >> 2 & 1);
                        auVar149._8_4_ = (uint)bVar14 * auVar124._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar95 >> 3 & 1);
                        auVar149._12_4_ =
                             (uint)bVar14 * auVar124._12_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar95 >> 4 & 1);
                        auVar149._16_4_ =
                             (uint)bVar14 * auVar124._16_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar95 >> 5 & 1);
                        auVar149._20_4_ =
                             (uint)bVar14 * auVar124._20_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar95 >> 6 & 1);
                        auVar149._24_4_ =
                             (uint)bVar14 * auVar124._24_4_ | (uint)!bVar14 * 0x7f800000;
                        auVar149._28_4_ =
                             (uint)(bVar95 >> 7) * auVar124._28_4_ |
                             (uint)!(bool)(bVar95 >> 7) * 0x7f800000;
                        auVar124 = vshufps_avx(auVar149,auVar149,0xb1);
                        auVar124 = vminps_avx(auVar149,auVar124);
                        auVar125 = vshufpd_avx(auVar124,auVar124,5);
                        auVar124 = vminps_avx(auVar124,auVar125);
                        auVar125 = vpermpd_avx2(auVar124,0x4e);
                        auVar124 = vminps_avx(auVar124,auVar125);
                        uVar161 = vcmpps_avx512vl(auVar149,auVar124,0);
                        bVar86 = (byte)uVar161 & bVar95;
                        bVar87 = bVar95;
                        if (bVar86 != 0) {
                          bVar87 = bVar86;
                        }
                        uVar208 = 0;
                        for (uVar90 = (uint)bVar87; (uVar90 & 1) == 0;
                            uVar90 = uVar90 >> 1 | 0x80000000) {
                          uVar208 = uVar208 + 1;
                        }
                        uVar88 = (ulong)uVar208;
                      }
                    } while (bVar95 != 0);
                  }
                }
              }
            }
          }
          auVar205 = ZEXT3264(auVar112);
          auVar184 = ZEXT3264(auVar114);
          lVar92 = lVar92 + 8;
          auVar220 = auVar221;
        } while ((int)lVar92 < iVar9);
      }
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar3;
      auVar32._0_4_ = uVar3;
      auVar32._8_4_ = uVar3;
      auVar32._12_4_ = uVar3;
      auVar32._16_4_ = uVar3;
      auVar32._20_4_ = uVar3;
      auVar32._24_4_ = uVar3;
      auVar32._28_4_ = uVar3;
      uVar161 = vcmpps_avx512vl(local_80,auVar32,2);
      uVar93 = (uint)uVar94 & (uint)uVar161;
      uVar94 = (ulong)uVar93;
    } while (uVar93 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }